

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iadst16_w4_sse2(__m128i *input,__m128i *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined8 uVar174;
  undefined8 uVar175;
  undefined8 uVar176;
  undefined8 uVar177;
  undefined8 uVar178;
  undefined8 uVar179;
  undefined8 uVar180;
  undefined8 uVar181;
  undefined8 uVar182;
  undefined8 uVar183;
  undefined8 uVar184;
  undefined8 uVar185;
  undefined8 uVar186;
  undefined8 uVar187;
  undefined8 uVar188;
  undefined8 uVar189;
  undefined8 uVar190;
  undefined8 uVar191;
  undefined8 uVar192;
  undefined8 uVar193;
  undefined8 uVar194;
  undefined8 uVar195;
  undefined8 uVar196;
  undefined8 uVar197;
  undefined8 uVar198;
  undefined8 uVar199;
  undefined8 uVar200;
  undefined8 uVar201;
  undefined8 uVar202;
  undefined8 uVar203;
  undefined8 uVar204;
  undefined8 uVar205;
  __m128i *in_RSI;
  undefined8 *in_RDI;
  int iVar206;
  int iVar211;
  int iVar213;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  int iVar207;
  int iVar212;
  int iVar214;
  int iVar215;
  int iVar216;
  undefined1 auVar210 [16];
  __m128i d0_19;
  __m128i c0_19;
  __m128i b0_19;
  __m128i a0_19;
  __m128i v0_19;
  __m128i u0_19;
  __m128i t0_19;
  __m128i d0_18;
  __m128i c0_18;
  __m128i b0_18;
  __m128i a0_18;
  __m128i v0_18;
  __m128i u0_18;
  __m128i t0_18;
  __m128i d0_17;
  __m128i c0_17;
  __m128i b0_17;
  __m128i a0_17;
  __m128i v0_17;
  __m128i u0_17;
  __m128i t0_17;
  __m128i d0_16;
  __m128i c0_16;
  __m128i b0_16;
  __m128i a0_16;
  __m128i v0_16;
  __m128i u0_16;
  __m128i t0_16;
  __m128i d0_15;
  __m128i c0_15;
  __m128i b0_15;
  __m128i a0_15;
  __m128i v0_15;
  __m128i u0_15;
  __m128i t0_15;
  __m128i d0_14;
  __m128i c0_14;
  __m128i b0_14;
  __m128i a0_14;
  __m128i v0_14;
  __m128i u0_14;
  __m128i t0_14;
  __m128i d0_13;
  __m128i c0_13;
  __m128i b0_13;
  __m128i a0_13;
  __m128i v0_13;
  __m128i u0_13;
  __m128i t0_13;
  __m128i d0_12;
  __m128i c0_12;
  __m128i b0_12;
  __m128i a0_12;
  __m128i v0_12;
  __m128i u0_12;
  __m128i t0_12;
  __m128i d0_11;
  __m128i c0_11;
  __m128i b0_11;
  __m128i a0_11;
  __m128i v0_11;
  __m128i u0_11;
  __m128i t0_11;
  __m128i d0_10;
  __m128i c0_10;
  __m128i b0_10;
  __m128i a0_10;
  __m128i v0_10;
  __m128i u0_10;
  __m128i t0_10;
  __m128i d0_9;
  __m128i c0_9;
  __m128i b0_9;
  __m128i a0_9;
  __m128i v0_9;
  __m128i u0_9;
  __m128i t0_9;
  __m128i d0_8;
  __m128i c0_8;
  __m128i b0_8;
  __m128i a0_8;
  __m128i v0_8;
  __m128i u0_8;
  __m128i t0_8;
  __m128i d0_7;
  __m128i c0_7;
  __m128i b0_7;
  __m128i a0_7;
  __m128i v0_7;
  __m128i u0_7;
  __m128i t0_7;
  __m128i d0_6;
  __m128i c0_6;
  __m128i b0_6;
  __m128i a0_6;
  __m128i v0_6;
  __m128i u0_6;
  __m128i t0_6;
  __m128i d0_5;
  __m128i c0_5;
  __m128i b0_5;
  __m128i a0_5;
  __m128i v0_5;
  __m128i u0_5;
  __m128i t0_5;
  __m128i d0_4;
  __m128i c0_4;
  __m128i b0_4;
  __m128i a0_4;
  __m128i v0_4;
  __m128i u0_4;
  __m128i t0_4;
  __m128i d0_3;
  __m128i c0_3;
  __m128i b0_3;
  __m128i a0_3;
  __m128i v0_3;
  __m128i u0_3;
  __m128i t0_3;
  __m128i d0_2;
  __m128i c0_2;
  __m128i b0_2;
  __m128i a0_2;
  __m128i v0_2;
  __m128i u0_2;
  __m128i t0_2;
  __m128i d0_1;
  __m128i c0_1;
  __m128i b0_1;
  __m128i a0_1;
  __m128i v0_1;
  __m128i u0_1;
  __m128i t0_1;
  __m128i d0;
  __m128i c0;
  __m128i b0;
  __m128i a0;
  __m128i v0;
  __m128i u0;
  __m128i t0;
  __m128i x [16];
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i cospi_m48_p16;
  __m128i cospi_p48_m16;
  __m128i cospi_p16_p48;
  __m128i cospi_m24_p40;
  __m128i cospi_m56_p08;
  __m128i cospi_p24_m40;
  __m128i cospi_p40_p24;
  __m128i cospi_p56_m08;
  __m128i cospi_p08_p56;
  __m128i cospi_p06_m58;
  __m128i cospi_p58_p06;
  __m128i cospi_p14_m50;
  __m128i cospi_p50_p14;
  __m128i cospi_p22_m42;
  __m128i cospi_p42_p22;
  __m128i cospi_p30_m34;
  __m128i cospi_p34_p30;
  __m128i cospi_p38_m26;
  __m128i cospi_p26_p38;
  __m128i cospi_p46_m18;
  __m128i cospi_p18_p46;
  __m128i cospi_p54_m10;
  __m128i cospi_p10_p54;
  __m128i cospi_p62_m02;
  __m128i cospi_p02_p62;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  undefined8 local_25d8;
  undefined8 uStackY_25d0;
  undefined8 local_25c8;
  undefined8 uStackY_25c0;
  undefined4 in_stack_ffffffffffffda68;
  undefined4 in_stack_ffffffffffffda6c;
  undefined8 local_2568;
  undefined8 uStack_2560;
  undefined8 local_2558;
  undefined8 uStack_2550;
  undefined8 local_24f8;
  undefined8 uStack_24f0;
  undefined8 local_24e8;
  undefined8 uStack_24e0;
  undefined8 local_2488;
  undefined8 uStack_2480;
  undefined8 local_2478;
  undefined8 uStack_2470;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 local_2408;
  undefined8 uStack_2400;
  undefined8 local_23a8;
  undefined8 uStack_23a0;
  undefined8 local_2398;
  undefined8 uStack_2390;
  undefined8 local_2338;
  undefined8 uStack_2330;
  undefined8 local_2328;
  undefined8 uStack_2320;
  undefined8 local_22c8;
  undefined8 uStack_22c0;
  undefined8 local_22b8;
  undefined8 uStack_22b0;
  undefined8 local_2258;
  undefined8 uStack_2250;
  undefined8 local_2248;
  undefined8 uStack_2240;
  undefined8 local_21e8;
  undefined8 uStack_21e0;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  undefined8 local_2178;
  undefined8 uStack_2170;
  undefined8 local_2168;
  undefined8 uStack_2160;
  undefined8 local_2108;
  undefined8 uStack_2100;
  undefined8 local_20f8;
  undefined8 uStack_20f0;
  undefined8 local_2098;
  undefined8 uStack_2090;
  undefined8 local_2088;
  undefined8 uStack_2080;
  undefined8 local_2028;
  undefined8 uStack_2020;
  undefined8 local_2018;
  undefined8 uStack_2010;
  undefined8 local_1fb8;
  undefined8 uStack_1fb0;
  undefined8 local_1fa8;
  undefined8 uStack_1fa0;
  undefined8 local_1f48;
  undefined8 uStack_1f40;
  undefined8 local_1f38;
  undefined8 uStack_1f30;
  undefined8 local_1ed8;
  undefined8 uStack_1ed0;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined8 local_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  undefined8 local_1d78;
  undefined8 uStack_1d70;
  __m128i local_1d58;
  undefined1 local_1d48 [16];
  undefined1 local_1d38 [16];
  undefined1 local_1d28 [16];
  undefined1 local_1d18 [16];
  undefined1 local_1d08 [16];
  undefined1 local_1cf8 [16];
  undefined1 local_1ce8 [16];
  undefined1 local_1cd8 [16];
  undefined1 local_1cc8 [16];
  undefined1 local_1cb8 [16];
  undefined1 local_1ca8 [16];
  undefined1 local_1c98 [16];
  undefined1 local_1c88 [16];
  undefined1 local_1c78 [16];
  undefined1 local_1c68 [16];
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  int local_1aa8;
  int iStack_1aa4;
  int iStack_1aa0;
  int iStack_1a9c;
  int32_t *local_1a98;
  undefined1 local_1a89;
  __m128i *local_1a88;
  undefined8 *local_1a80;
  int local_1a78;
  undefined4 local_1a74;
  uint local_1a70;
  int local_1a6c;
  uint local_1a68;
  uint local_1a64;
  uint local_1a60;
  int local_1a5c;
  uint local_1a58;
  int local_1a54;
  uint local_1a50;
  int local_1a4c;
  uint local_1a48;
  int local_1a44;
  uint local_1a40;
  int local_1a3c;
  uint local_1a38;
  int local_1a34;
  uint local_1a30;
  int local_1a2c;
  uint local_1a28;
  int local_1a24;
  uint local_1a20;
  int local_1a1c;
  uint local_1a18;
  int local_1a14;
  uint local_1a10;
  undefined4 local_1a0c;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  int local_1288;
  int iStack_1284;
  int iStack_1280;
  int iStack_127c;
  undefined8 local_1278;
  undefined8 uStack_1270;
  int local_1268;
  int iStack_1264;
  int iStack_1260;
  int iStack_125c;
  undefined8 local_1258;
  undefined8 uStack_1250;
  int local_1248;
  int iStack_1244;
  int iStack_1240;
  int iStack_123c;
  undefined8 local_1238;
  undefined8 uStack_1230;
  int local_1228;
  int iStack_1224;
  int iStack_1220;
  int iStack_121c;
  undefined8 local_1218;
  undefined8 uStack_1210;
  int local_1208;
  int iStack_1204;
  int iStack_1200;
  int iStack_11fc;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  int local_11e8;
  int iStack_11e4;
  int iStack_11e0;
  int iStack_11dc;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  int local_11c8;
  int iStack_11c4;
  int iStack_11c0;
  int iStack_11bc;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  int local_11a8;
  int iStack_11a4;
  int iStack_11a0;
  int iStack_119c;
  undefined8 local_1198;
  undefined8 uStack_1190;
  int local_1188;
  int iStack_1184;
  int iStack_1180;
  int iStack_117c;
  undefined8 local_1178;
  undefined8 uStack_1170;
  int local_1168;
  int iStack_1164;
  int iStack_1160;
  int iStack_115c;
  undefined8 local_1158;
  undefined8 uStack_1150;
  int local_1148;
  int iStack_1144;
  int iStack_1140;
  int iStack_113c;
  undefined8 local_1138;
  undefined8 uStack_1130;
  int local_1128;
  int iStack_1124;
  int iStack_1120;
  int iStack_111c;
  undefined8 local_1118;
  undefined8 uStack_1110;
  int local_1108;
  int iStack_1104;
  int iStack_1100;
  int iStack_10fc;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  int local_10e8;
  int iStack_10e4;
  int iStack_10e0;
  int iStack_10dc;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  int local_10c8;
  int iStack_10c4;
  int iStack_10c0;
  int iStack_10bc;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  int local_10a8;
  int iStack_10a4;
  int iStack_10a0;
  int iStack_109c;
  undefined8 local_1098;
  undefined8 uStack_1090;
  int local_1088;
  int iStack_1084;
  int iStack_1080;
  int iStack_107c;
  undefined8 local_1078;
  undefined8 uStack_1070;
  int local_1068;
  int iStack_1064;
  int iStack_1060;
  int iStack_105c;
  undefined8 local_1058;
  undefined8 uStack_1050;
  int local_1048;
  int iStack_1044;
  int iStack_1040;
  int iStack_103c;
  undefined8 local_1038;
  undefined8 uStack_1030;
  int local_1028;
  int iStack_1024;
  int iStack_1020;
  int iStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  int local_1008;
  int iStack_1004;
  int iStack_1000;
  int iStack_ffc;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  int local_fe8;
  int iStack_fe4;
  int iStack_fe0;
  int iStack_fdc;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  int local_fc8;
  int iStack_fc4;
  int iStack_fc0;
  int iStack_fbc;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  int local_fa8;
  int iStack_fa4;
  int iStack_fa0;
  int iStack_f9c;
  undefined8 local_f98;
  undefined8 uStack_f90;
  int local_f88;
  int iStack_f84;
  int iStack_f80;
  int iStack_f7c;
  undefined8 local_f78;
  undefined8 uStack_f70;
  int local_f68;
  int iStack_f64;
  int iStack_f60;
  int iStack_f5c;
  undefined8 local_f58;
  undefined8 uStack_f50;
  int local_f48;
  int iStack_f44;
  int iStack_f40;
  int iStack_f3c;
  undefined8 local_f38;
  undefined8 uStack_f30;
  int local_f28;
  int iStack_f24;
  int iStack_f20;
  int iStack_f1c;
  undefined8 local_f18;
  undefined8 uStack_f10;
  int local_f08;
  int iStack_f04;
  int iStack_f00;
  int iStack_efc;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  int local_ee8;
  int iStack_ee4;
  int iStack_ee0;
  int iStack_edc;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  int local_ec8;
  int iStack_ec4;
  int iStack_ec0;
  int iStack_ebc;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  int local_ea8;
  int iStack_ea4;
  int iStack_ea0;
  int iStack_e9c;
  undefined8 local_e98;
  undefined8 uStack_e90;
  int local_e88;
  int iStack_e84;
  int iStack_e80;
  int iStack_e7c;
  undefined8 local_e78;
  undefined8 uStack_e70;
  int local_e68;
  int iStack_e64;
  int iStack_e60;
  int iStack_e5c;
  undefined8 local_e58;
  undefined8 uStack_e50;
  int local_e48;
  int iStack_e44;
  int iStack_e40;
  int iStack_e3c;
  undefined8 local_e38;
  undefined8 uStack_e30;
  int local_e28;
  int iStack_e24;
  int iStack_e20;
  int iStack_e1c;
  undefined8 local_e18;
  undefined8 uStack_e10;
  int local_e08;
  int iStack_e04;
  int iStack_e00;
  int iStack_dfc;
  undefined8 local_df8;
  undefined8 uStack_df0;
  int local_de8;
  int iStack_de4;
  int iStack_de0;
  int iStack_ddc;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  int local_dc8;
  int iStack_dc4;
  int iStack_dc0;
  int iStack_dbc;
  undefined8 local_db8;
  undefined8 uStack_db0;
  int local_da8;
  int iStack_da4;
  int iStack_da0;
  int iStack_d9c;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined4 local_d7c;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined4 local_d5c;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined4 local_d3c;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined4 local_d1c;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined4 local_cfc;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined4 local_cdc;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined4 local_cbc;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined4 local_c9c;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined4 local_c7c;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined4 local_c5c;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined4 local_c3c;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined4 local_c1c;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined4 local_bfc;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined4 local_bdc;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined4 local_bbc;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined4 local_b9c;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined4 local_b7c;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined4 local_b5c;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined4 local_b3c;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined4 local_b1c;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined4 local_afc;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined4 local_adc;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined4 local_abc;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined4 local_a9c;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined4 local_a7c;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined4 local_a5c;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined4 local_a3c;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined4 local_a1c;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined4 local_9fc;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined4 local_9dc;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined4 local_9bc;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined4 local_99c;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined4 local_97c;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined4 local_95c;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined4 local_93c;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined4 local_91c;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined4 local_8fc;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined4 local_8dc;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined4 local_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined4 local_89c;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  int local_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  undefined4 local_378;
  undefined4 local_374;
  undefined4 local_370;
  undefined4 local_36c;
  undefined8 local_368;
  undefined8 uStack_360;
  uint local_358;
  uint local_354;
  uint local_350;
  uint local_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  int local_338;
  int local_334;
  int local_330;
  int local_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  uint local_318;
  uint local_314;
  uint local_310;
  uint local_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  uint local_2d8;
  uint local_2d4;
  uint local_2d0;
  uint local_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  uint local_298;
  uint local_294;
  uint local_290;
  uint local_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  uint local_258;
  uint local_254;
  uint local_250;
  uint local_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  uint local_218;
  uint local_214;
  uint local_210;
  uint local_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  uint local_1d8;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  uint local_198;
  uint local_194;
  uint local_190;
  uint local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_1a89 = 0xc;
  local_1a88 = in_RSI;
  local_1a80 = in_RDI;
  local_1a98 = cospi_arr(0xc);
  local_1a0c = 0x800;
  local_36c = 0x800;
  local_370 = 0x800;
  local_374 = 0x800;
  local_378 = 0x800;
  local_1aa8 = 0x800;
  iStack_1aa4 = 0x800;
  iStack_1aa0 = 0x800;
  iStack_1a9c = 0x800;
  local_1a10 = (uint)*(ushort *)(local_1a98 + 2) | local_1a98[0x3e] << 0x10;
  local_1ab8 = CONCAT44(local_1a10,local_1a10);
  uStack_1ab0 = CONCAT44(local_1a10,local_1a10);
  local_1a14 = (uint)*(ushort *)(local_1a98 + 0x3e) + local_1a98[2] * -0x10000;
  local_1ac8 = CONCAT44(local_1a14,local_1a14);
  uStack_1ac0 = CONCAT44(local_1a14,local_1a14);
  local_1a18 = (uint)*(ushort *)(local_1a98 + 10) | local_1a98[0x36] << 0x10;
  local_1ad8 = CONCAT44(local_1a18,local_1a18);
  uStack_1ad0 = CONCAT44(local_1a18,local_1a18);
  local_1a1c = (uint)*(ushort *)(local_1a98 + 0x36) + local_1a98[10] * -0x10000;
  local_1ae8 = CONCAT44(local_1a1c,local_1a1c);
  uStack_1ae0 = CONCAT44(local_1a1c,local_1a1c);
  local_1a20 = (uint)*(ushort *)(local_1a98 + 0x12) | local_1a98[0x2e] << 0x10;
  local_1af8 = CONCAT44(local_1a20,local_1a20);
  uStack_1af0 = CONCAT44(local_1a20,local_1a20);
  local_1a24 = (uint)*(ushort *)(local_1a98 + 0x2e) + local_1a98[0x12] * -0x10000;
  local_1b08 = CONCAT44(local_1a24,local_1a24);
  uStack_1b00 = CONCAT44(local_1a24,local_1a24);
  local_1a28 = (uint)*(ushort *)(local_1a98 + 0x1a) | local_1a98[0x26] << 0x10;
  local_1b18 = CONCAT44(local_1a28,local_1a28);
  uStack_1b10 = CONCAT44(local_1a28,local_1a28);
  local_1a2c = (uint)*(ushort *)(local_1a98 + 0x26) + local_1a98[0x1a] * -0x10000;
  local_1b28 = CONCAT44(local_1a2c,local_1a2c);
  uStack_1b20 = CONCAT44(local_1a2c,local_1a2c);
  local_1a30 = (uint)*(ushort *)(local_1a98 + 0x22) | local_1a98[0x1e] << 0x10;
  local_1b38 = CONCAT44(local_1a30,local_1a30);
  uStack_1b30 = CONCAT44(local_1a30,local_1a30);
  local_1a34 = (uint)*(ushort *)(local_1a98 + 0x1e) + local_1a98[0x22] * -0x10000;
  local_1b48 = CONCAT44(local_1a34,local_1a34);
  uStack_1b40 = CONCAT44(local_1a34,local_1a34);
  local_1a38 = (uint)*(ushort *)(local_1a98 + 0x2a) | local_1a98[0x16] << 0x10;
  local_1b58 = CONCAT44(local_1a38,local_1a38);
  uStack_1b50 = CONCAT44(local_1a38,local_1a38);
  local_1a3c = (uint)*(ushort *)(local_1a98 + 0x16) + local_1a98[0x2a] * -0x10000;
  local_1b68 = CONCAT44(local_1a3c,local_1a3c);
  uStack_1b60 = CONCAT44(local_1a3c,local_1a3c);
  local_1a40 = (uint)*(ushort *)(local_1a98 + 0x32) | local_1a98[0xe] << 0x10;
  local_1b78 = CONCAT44(local_1a40,local_1a40);
  uStack_1b70 = CONCAT44(local_1a40,local_1a40);
  local_1a44 = (uint)*(ushort *)(local_1a98 + 0xe) + local_1a98[0x32] * -0x10000;
  local_1b88 = CONCAT44(local_1a44,local_1a44);
  uStack_1b80 = CONCAT44(local_1a44,local_1a44);
  local_1a48 = (uint)*(ushort *)(local_1a98 + 0x3a) | local_1a98[6] << 0x10;
  local_1b98 = CONCAT44(local_1a48,local_1a48);
  uStack_1b90 = CONCAT44(local_1a48,local_1a48);
  local_1a4c = (uint)*(ushort *)(local_1a98 + 6) + local_1a98[0x3a] * -0x10000;
  local_1ba8 = CONCAT44(local_1a4c,local_1a4c);
  uStack_1ba0 = CONCAT44(local_1a4c,local_1a4c);
  local_1a50 = (uint)*(ushort *)(local_1a98 + 8) | local_1a98[0x38] << 0x10;
  local_1bb8 = CONCAT44(local_1a50,local_1a50);
  uStack_1bb0 = CONCAT44(local_1a50,local_1a50);
  local_1a54 = (uint)*(ushort *)(local_1a98 + 0x38) + local_1a98[8] * -0x10000;
  local_1bc8 = CONCAT44(local_1a54,local_1a54);
  uStack_1bc0 = CONCAT44(local_1a54,local_1a54);
  local_1a58 = (uint)*(ushort *)(local_1a98 + 0x28) | local_1a98[0x18] << 0x10;
  local_1bd8 = CONCAT44(local_1a58,local_1a58);
  uStack_1bd0 = CONCAT44(local_1a58,local_1a58);
  local_1a5c = (uint)*(ushort *)(local_1a98 + 0x18) + local_1a98[0x28] * -0x10000;
  local_1be8 = CONCAT44(local_1a5c,local_1a5c);
  uStack_1be0 = CONCAT44(local_1a5c,local_1a5c);
  local_1a60 = -local_1a98[0x38] & 0xffffU | local_1a98[8] << 0x10;
  local_1bf8 = CONCAT44(local_1a60,local_1a60);
  uStack_1bf0 = CONCAT44(local_1a60,local_1a60);
  local_1a64 = -local_1a98[0x18] & 0xffffU | local_1a98[0x28] << 0x10;
  local_1c08 = CONCAT44(local_1a64,local_1a64);
  uStack_1c00 = CONCAT44(local_1a64,local_1a64);
  local_1a68 = (uint)*(ushort *)(local_1a98 + 0x10) | local_1a98[0x30] << 0x10;
  local_1c18 = CONCAT44(local_1a68,local_1a68);
  uStack_1c10 = CONCAT44(local_1a68,local_1a68);
  local_1a6c = (uint)*(ushort *)(local_1a98 + 0x30) + local_1a98[0x10] * -0x10000;
  local_1c28 = CONCAT44(local_1a6c,local_1a6c);
  uStack_1c20 = CONCAT44(local_1a6c,local_1a6c);
  local_1a70 = -local_1a98[0x30] & 0xffffU | local_1a98[0x10] << 0x10;
  local_1c38 = CONCAT44(local_1a70,local_1a70);
  uStack_1c30 = CONCAT44(local_1a70,local_1a70);
  local_1a74 = CONCAT22((short)local_1a98[0x20],(short)local_1a98[0x20]);
  local_1c48 = CONCAT44(local_1a74,local_1a74);
  uStack_1c40 = CONCAT44(local_1a74,local_1a74);
  local_1a78 = (local_1a98[0x20] & 0xffffU) + local_1a98[0x20] * -0x10000;
  local_1c58 = CONCAT44(local_1a78,local_1a78);
  uStack_1c50 = CONCAT44(local_1a78,local_1a78);
  uVar1 = local_1a80[0x1e];
  uStack_1790 = local_1a80[0x1f];
  uVar2 = *local_1a80;
  uStack_17a0 = local_1a80[1];
  uVar3 = local_1a80[0x1a];
  uStack_17b0 = local_1a80[0x1b];
  uVar4 = local_1a80[4];
  uStack_17c0 = local_1a80[5];
  uVar5 = local_1a80[0x16];
  uStack_17d0 = local_1a80[0x17];
  uVar6 = local_1a80[8];
  uStack_17e0 = local_1a80[9];
  uVar7 = local_1a80[0x12];
  uStack_17f0 = local_1a80[0x13];
  uVar8 = local_1a80[0xc];
  uStack_1800 = local_1a80[0xd];
  uVar9 = local_1a80[0xe];
  uStack_1810 = local_1a80[0xf];
  uVar10 = local_1a80[0x10];
  uStack_1820 = local_1a80[0x11];
  uVar11 = local_1a80[10];
  uStack_1830 = local_1a80[0xb];
  uVar12 = local_1a80[0x14];
  uStack_1840 = local_1a80[0x15];
  uVar13 = local_1a80[6];
  uStack_1850 = local_1a80[7];
  uVar14 = local_1a80[0x18];
  uStack_1860 = local_1a80[0x19];
  uVar15 = local_1a80[2];
  uStack_1870 = local_1a80[3];
  uVar16 = local_1a80[0x1c];
  uStack_1880 = local_1a80[0x1d];
  local_1798._0_2_ = (undefined2)uVar1;
  local_1798._2_2_ = (undefined2)((ulong)uVar1 >> 0x10);
  local_1798._4_2_ = (undefined2)((ulong)uVar1 >> 0x20);
  local_1798._6_2_ = (undefined2)((ulong)uVar1 >> 0x30);
  local_17a8._0_2_ = (undefined2)uVar2;
  local_17a8._2_2_ = (undefined2)((ulong)uVar2 >> 0x10);
  local_17a8._4_2_ = (undefined2)((ulong)uVar2 >> 0x20);
  local_17a8._6_2_ = (undefined2)((ulong)uVar2 >> 0x30);
  local_1298 = CONCAT26(local_17a8._2_2_,
                        CONCAT24(local_1798._2_2_,
                                 CONCAT22((undefined2)local_17a8,(undefined2)local_1798)));
  uStack_1290 = CONCAT26(local_17a8._6_2_,
                         CONCAT24(local_1798._6_2_,CONCAT22(local_17a8._4_2_,local_1798._4_2_)));
  auVar93._8_8_ = uStack_1290;
  auVar93._0_8_ = local_1298;
  auVar92._8_8_ = uStack_1ab0;
  auVar92._0_8_ = local_1ab8;
  auVar208 = pmaddwd(auVar93,auVar92);
  local_12b8 = CONCAT26(local_17a8._2_2_,
                        CONCAT24(local_1798._2_2_,
                                 CONCAT22((undefined2)local_17a8,(undefined2)local_1798)));
  uStack_12b0 = CONCAT26(local_17a8._6_2_,
                         CONCAT24(local_1798._6_2_,CONCAT22(local_17a8._4_2_,local_1798._4_2_)));
  auVar91._8_8_ = uStack_12b0;
  auVar91._0_8_ = local_12b8;
  auVar90._8_8_ = uStack_1ac0;
  auVar90._0_8_ = local_1ac8;
  auVar209 = pmaddwd(auVar91,auVar90);
  local_1d78 = auVar208._0_8_;
  uStack_1d70 = auVar208._8_8_;
  local_d98 = local_1d78;
  uVar204 = local_d98;
  uStack_d90 = uStack_1d70;
  uVar205 = uStack_d90;
  local_d98._0_4_ = auVar208._0_4_;
  local_d98._4_4_ = auVar208._4_4_;
  uStack_d90._0_4_ = auVar208._8_4_;
  uStack_d90._4_4_ = auVar208._12_4_;
  local_1d88 = auVar209._0_8_;
  uStack_1d80 = auVar209._8_8_;
  local_db8 = local_1d88;
  uVar202 = local_db8;
  uStack_db0 = uStack_1d80;
  uVar203 = uStack_db0;
  local_db8._0_4_ = auVar209._0_4_;
  local_db8._4_4_ = auVar209._4_4_;
  uStack_db0._0_4_ = auVar209._8_4_;
  uStack_db0._4_4_ = auVar209._12_4_;
  local_898 = CONCAT44(local_d98._4_4_ + 0x800,(int)local_d98 + 0x800);
  uStack_890 = CONCAT44(uStack_d90._4_4_ + 0x800,(int)uStack_d90 + 0x800);
  local_89c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_d98 + 0x800 >> auVar208;
  iVar211 = local_d98._4_4_ + 0x800 >> auVar208;
  iVar213 = (int)uStack_d90 + 0x800 >> auVar208;
  iVar215 = uStack_d90._4_4_ + 0x800 >> auVar208;
  local_8b8 = CONCAT44(local_db8._4_4_ + 0x800,(int)local_db8 + 0x800);
  uStack_8b0 = CONCAT44(uStack_db0._4_4_ + 0x800,(int)uStack_db0 + 0x800);
  local_8bc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_db8 + 0x800 >> auVar208;
  iVar212 = local_db8._4_4_ + 0x800 >> auVar208;
  iVar214 = (int)uStack_db0 + 0x800 >> auVar208;
  iVar216 = uStack_db0._4_4_ + 0x800 >> auVar208;
  local_398 = CONCAT44(iVar211,iVar206);
  uStack_390 = CONCAT44(iVar215,iVar213);
  local_3a8 = CONCAT44(iVar211,iVar206);
  uStack_3a0 = CONCAT44(iVar215,iVar213);
  auVar173._8_8_ = uStack_390;
  auVar173._0_8_ = local_398;
  auVar172._8_8_ = uStack_3a0;
  auVar172._0_8_ = local_3a8;
  local_1d58 = (__m128i)packssdw(auVar173,auVar172);
  local_3b8 = CONCAT44(iVar212,iVar207);
  uStack_3b0 = CONCAT44(iVar216,iVar214);
  local_3c8 = CONCAT44(iVar212,iVar207);
  uStack_3c0 = CONCAT44(iVar216,iVar214);
  auVar171._8_8_ = uStack_3b0;
  auVar171._0_8_ = local_3b8;
  auVar170._8_8_ = uStack_3c0;
  auVar170._0_8_ = local_3c8;
  local_1d48 = packssdw(auVar171,auVar170);
  local_17b8._0_2_ = (undefined2)uVar3;
  local_17b8._2_2_ = (undefined2)((ulong)uVar3 >> 0x10);
  local_17b8._4_2_ = (undefined2)((ulong)uVar3 >> 0x20);
  local_17b8._6_2_ = (undefined2)((ulong)uVar3 >> 0x30);
  local_17c8._0_2_ = (undefined2)uVar4;
  local_17c8._2_2_ = (undefined2)((ulong)uVar4 >> 0x10);
  local_17c8._4_2_ = (undefined2)((ulong)uVar4 >> 0x20);
  local_17c8._6_2_ = (undefined2)((ulong)uVar4 >> 0x30);
  local_12d8 = CONCAT26(local_17c8._2_2_,
                        CONCAT24(local_17b8._2_2_,
                                 CONCAT22((undefined2)local_17c8,(undefined2)local_17b8)));
  uStack_12d0 = CONCAT26(local_17c8._6_2_,
                         CONCAT24(local_17b8._6_2_,CONCAT22(local_17c8._4_2_,local_17b8._4_2_)));
  auVar89._8_8_ = uStack_12d0;
  auVar89._0_8_ = local_12d8;
  auVar88._8_8_ = uStack_1ad0;
  auVar88._0_8_ = local_1ad8;
  auVar208 = pmaddwd(auVar89,auVar88);
  local_12f8 = CONCAT26(local_17c8._2_2_,
                        CONCAT24(local_17b8._2_2_,
                                 CONCAT22((undefined2)local_17c8,(undefined2)local_17b8)));
  uStack_12f0 = CONCAT26(local_17c8._6_2_,
                         CONCAT24(local_17b8._6_2_,CONCAT22(local_17c8._4_2_,local_17b8._4_2_)));
  auVar87._8_8_ = uStack_12f0;
  auVar87._0_8_ = local_12f8;
  auVar86._8_8_ = uStack_1ae0;
  auVar86._0_8_ = local_1ae8;
  auVar209 = pmaddwd(auVar87,auVar86);
  local_1de8 = auVar208._0_8_;
  uStack_1de0 = auVar208._8_8_;
  local_dd8 = local_1de8;
  uVar200 = local_dd8;
  uStack_dd0 = uStack_1de0;
  uVar201 = uStack_dd0;
  local_dd8._0_4_ = auVar208._0_4_;
  local_dd8._4_4_ = auVar208._4_4_;
  uStack_dd0._0_4_ = auVar208._8_4_;
  uStack_dd0._4_4_ = auVar208._12_4_;
  local_1df8 = auVar209._0_8_;
  uStack_1df0 = auVar209._8_8_;
  local_df8 = local_1df8;
  uVar198 = local_df8;
  uStack_df0 = uStack_1df0;
  uVar199 = uStack_df0;
  local_df8._0_4_ = auVar209._0_4_;
  local_df8._4_4_ = auVar209._4_4_;
  uStack_df0._0_4_ = auVar209._8_4_;
  uStack_df0._4_4_ = auVar209._12_4_;
  local_8d8 = CONCAT44(local_dd8._4_4_ + 0x800,(int)local_dd8 + 0x800);
  uStack_8d0 = CONCAT44(uStack_dd0._4_4_ + 0x800,(int)uStack_dd0 + 0x800);
  local_8dc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_dd8 + 0x800 >> auVar208;
  iVar211 = local_dd8._4_4_ + 0x800 >> auVar208;
  iVar213 = (int)uStack_dd0 + 0x800 >> auVar208;
  iVar215 = uStack_dd0._4_4_ + 0x800 >> auVar208;
  local_8f8 = CONCAT44(local_df8._4_4_ + 0x800,(int)local_df8 + 0x800);
  uStack_8f0 = CONCAT44(uStack_df0._4_4_ + 0x800,(int)uStack_df0 + 0x800);
  local_8fc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_df8 + 0x800 >> auVar208;
  iVar212 = local_df8._4_4_ + 0x800 >> auVar208;
  iVar214 = (int)uStack_df0 + 0x800 >> auVar208;
  iVar216 = uStack_df0._4_4_ + 0x800 >> auVar208;
  local_3d8 = CONCAT44(iVar211,iVar206);
  uStack_3d0 = CONCAT44(iVar215,iVar213);
  local_3e8 = CONCAT44(iVar211,iVar206);
  uStack_3e0 = CONCAT44(iVar215,iVar213);
  auVar169._8_8_ = uStack_3d0;
  auVar169._0_8_ = local_3d8;
  auVar168._8_8_ = uStack_3e0;
  auVar168._0_8_ = local_3e8;
  local_1d38 = packssdw(auVar169,auVar168);
  local_3f8 = CONCAT44(iVar212,iVar207);
  uStack_3f0 = CONCAT44(iVar216,iVar214);
  local_408 = CONCAT44(iVar212,iVar207);
  uStack_400 = CONCAT44(iVar216,iVar214);
  auVar167._8_8_ = uStack_3f0;
  auVar167._0_8_ = local_3f8;
  auVar166._8_8_ = uStack_400;
  auVar166._0_8_ = local_408;
  local_1d28 = packssdw(auVar167,auVar166);
  local_17d8._0_2_ = (undefined2)uVar5;
  local_17d8._2_2_ = (undefined2)((ulong)uVar5 >> 0x10);
  local_17d8._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
  local_17d8._6_2_ = (undefined2)((ulong)uVar5 >> 0x30);
  local_17e8._0_2_ = (undefined2)uVar6;
  local_17e8._2_2_ = (undefined2)((ulong)uVar6 >> 0x10);
  local_17e8._4_2_ = (undefined2)((ulong)uVar6 >> 0x20);
  local_17e8._6_2_ = (undefined2)((ulong)uVar6 >> 0x30);
  local_1318 = CONCAT26(local_17e8._2_2_,
                        CONCAT24(local_17d8._2_2_,
                                 CONCAT22((undefined2)local_17e8,(undefined2)local_17d8)));
  uStack_1310 = CONCAT26(local_17e8._6_2_,
                         CONCAT24(local_17d8._6_2_,CONCAT22(local_17e8._4_2_,local_17d8._4_2_)));
  auVar85._8_8_ = uStack_1310;
  auVar85._0_8_ = local_1318;
  auVar84._8_8_ = uStack_1af0;
  auVar84._0_8_ = local_1af8;
  auVar208 = pmaddwd(auVar85,auVar84);
  local_1338 = CONCAT26(local_17e8._2_2_,
                        CONCAT24(local_17d8._2_2_,
                                 CONCAT22((undefined2)local_17e8,(undefined2)local_17d8)));
  uStack_1330 = CONCAT26(local_17e8._6_2_,
                         CONCAT24(local_17d8._6_2_,CONCAT22(local_17e8._4_2_,local_17d8._4_2_)));
  auVar83._8_8_ = uStack_1330;
  auVar83._0_8_ = local_1338;
  auVar82._8_8_ = uStack_1b00;
  auVar82._0_8_ = local_1b08;
  auVar209 = pmaddwd(auVar83,auVar82);
  local_1e58 = auVar208._0_8_;
  uStack_1e50 = auVar208._8_8_;
  local_e18 = local_1e58;
  uVar196 = local_e18;
  uStack_e10 = uStack_1e50;
  uVar197 = uStack_e10;
  local_e18._0_4_ = auVar208._0_4_;
  local_e18._4_4_ = auVar208._4_4_;
  uStack_e10._0_4_ = auVar208._8_4_;
  uStack_e10._4_4_ = auVar208._12_4_;
  local_1e68 = auVar209._0_8_;
  uStack_1e60 = auVar209._8_8_;
  local_e38 = local_1e68;
  uVar194 = local_e38;
  uStack_e30 = uStack_1e60;
  uVar195 = uStack_e30;
  local_e38._0_4_ = auVar209._0_4_;
  local_e38._4_4_ = auVar209._4_4_;
  uStack_e30._0_4_ = auVar209._8_4_;
  uStack_e30._4_4_ = auVar209._12_4_;
  local_918 = CONCAT44(local_e18._4_4_ + 0x800,(int)local_e18 + 0x800);
  uStack_910 = CONCAT44(uStack_e10._4_4_ + 0x800,(int)uStack_e10 + 0x800);
  local_91c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_e18 + 0x800 >> auVar208;
  iVar211 = local_e18._4_4_ + 0x800 >> auVar208;
  iVar213 = (int)uStack_e10 + 0x800 >> auVar208;
  iVar215 = uStack_e10._4_4_ + 0x800 >> auVar208;
  local_938 = CONCAT44(local_e38._4_4_ + 0x800,(int)local_e38 + 0x800);
  uStack_930 = CONCAT44(uStack_e30._4_4_ + 0x800,(int)uStack_e30 + 0x800);
  local_93c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_e38 + 0x800 >> auVar208;
  iVar212 = local_e38._4_4_ + 0x800 >> auVar208;
  iVar214 = (int)uStack_e30 + 0x800 >> auVar208;
  iVar216 = uStack_e30._4_4_ + 0x800 >> auVar208;
  local_418 = CONCAT44(iVar211,iVar206);
  uStack_410 = CONCAT44(iVar215,iVar213);
  local_428 = CONCAT44(iVar211,iVar206);
  uStack_420 = CONCAT44(iVar215,iVar213);
  auVar165._8_8_ = uStack_410;
  auVar165._0_8_ = local_418;
  auVar164._8_8_ = uStack_420;
  auVar164._0_8_ = local_428;
  local_1d18 = packssdw(auVar165,auVar164);
  local_438 = CONCAT44(iVar212,iVar207);
  uStack_430 = CONCAT44(iVar216,iVar214);
  local_448 = CONCAT44(iVar212,iVar207);
  uStack_440 = CONCAT44(iVar216,iVar214);
  auVar163._8_8_ = uStack_430;
  auVar163._0_8_ = local_438;
  auVar162._8_8_ = uStack_440;
  auVar162._0_8_ = local_448;
  local_1d08 = packssdw(auVar163,auVar162);
  local_17f8._0_2_ = (undefined2)uVar7;
  local_17f8._2_2_ = (undefined2)((ulong)uVar7 >> 0x10);
  local_17f8._4_2_ = (undefined2)((ulong)uVar7 >> 0x20);
  local_17f8._6_2_ = (undefined2)((ulong)uVar7 >> 0x30);
  local_1808._0_2_ = (undefined2)uVar8;
  local_1808._2_2_ = (undefined2)((ulong)uVar8 >> 0x10);
  local_1808._4_2_ = (undefined2)((ulong)uVar8 >> 0x20);
  local_1808._6_2_ = (undefined2)((ulong)uVar8 >> 0x30);
  local_1358 = CONCAT26(local_1808._2_2_,
                        CONCAT24(local_17f8._2_2_,
                                 CONCAT22((undefined2)local_1808,(undefined2)local_17f8)));
  uStack_1350 = CONCAT26(local_1808._6_2_,
                         CONCAT24(local_17f8._6_2_,CONCAT22(local_1808._4_2_,local_17f8._4_2_)));
  auVar81._8_8_ = uStack_1350;
  auVar81._0_8_ = local_1358;
  auVar80._8_8_ = uStack_1b10;
  auVar80._0_8_ = local_1b18;
  auVar208 = pmaddwd(auVar81,auVar80);
  local_1378 = CONCAT26(local_1808._2_2_,
                        CONCAT24(local_17f8._2_2_,
                                 CONCAT22((undefined2)local_1808,(undefined2)local_17f8)));
  uStack_1370 = CONCAT26(local_1808._6_2_,
                         CONCAT24(local_17f8._6_2_,CONCAT22(local_1808._4_2_,local_17f8._4_2_)));
  auVar79._8_8_ = uStack_1370;
  auVar79._0_8_ = local_1378;
  auVar78._8_8_ = uStack_1b20;
  auVar78._0_8_ = local_1b28;
  auVar209 = pmaddwd(auVar79,auVar78);
  local_1ec8 = auVar208._0_8_;
  uStack_1ec0 = auVar208._8_8_;
  local_e58 = local_1ec8;
  uVar192 = local_e58;
  uStack_e50 = uStack_1ec0;
  uVar193 = uStack_e50;
  local_e58._0_4_ = auVar208._0_4_;
  local_e58._4_4_ = auVar208._4_4_;
  uStack_e50._0_4_ = auVar208._8_4_;
  uStack_e50._4_4_ = auVar208._12_4_;
  local_1ed8 = auVar209._0_8_;
  uStack_1ed0 = auVar209._8_8_;
  local_e78 = local_1ed8;
  uVar190 = local_e78;
  uStack_e70 = uStack_1ed0;
  uVar191 = uStack_e70;
  local_e78._0_4_ = auVar209._0_4_;
  local_e78._4_4_ = auVar209._4_4_;
  uStack_e70._0_4_ = auVar209._8_4_;
  uStack_e70._4_4_ = auVar209._12_4_;
  local_958 = CONCAT44(local_e58._4_4_ + 0x800,(int)local_e58 + 0x800);
  uStack_950 = CONCAT44(uStack_e50._4_4_ + 0x800,(int)uStack_e50 + 0x800);
  local_95c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_e58 + 0x800 >> auVar208;
  iVar211 = local_e58._4_4_ + 0x800 >> auVar208;
  iVar213 = (int)uStack_e50 + 0x800 >> auVar208;
  iVar215 = uStack_e50._4_4_ + 0x800 >> auVar208;
  local_978 = CONCAT44(local_e78._4_4_ + 0x800,(int)local_e78 + 0x800);
  uStack_970 = CONCAT44(uStack_e70._4_4_ + 0x800,(int)uStack_e70 + 0x800);
  local_97c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_e78 + 0x800 >> auVar208;
  iVar212 = local_e78._4_4_ + 0x800 >> auVar208;
  iVar214 = (int)uStack_e70 + 0x800 >> auVar208;
  iVar216 = uStack_e70._4_4_ + 0x800 >> auVar208;
  local_458 = CONCAT44(iVar211,iVar206);
  uStack_450 = CONCAT44(iVar215,iVar213);
  local_468 = CONCAT44(iVar211,iVar206);
  uStack_460 = CONCAT44(iVar215,iVar213);
  auVar161._8_8_ = uStack_450;
  auVar161._0_8_ = local_458;
  auVar160._8_8_ = uStack_460;
  auVar160._0_8_ = local_468;
  local_1cf8 = packssdw(auVar161,auVar160);
  local_478 = CONCAT44(iVar212,iVar207);
  uStack_470 = CONCAT44(iVar216,iVar214);
  local_488 = CONCAT44(iVar212,iVar207);
  uStack_480 = CONCAT44(iVar216,iVar214);
  auVar159._8_8_ = uStack_470;
  auVar159._0_8_ = local_478;
  auVar158._8_8_ = uStack_480;
  auVar158._0_8_ = local_488;
  local_1ce8 = packssdw(auVar159,auVar158);
  local_1818._0_2_ = (undefined2)uVar9;
  local_1818._2_2_ = (undefined2)((ulong)uVar9 >> 0x10);
  local_1818._4_2_ = (undefined2)((ulong)uVar9 >> 0x20);
  local_1818._6_2_ = (undefined2)((ulong)uVar9 >> 0x30);
  local_1828._0_2_ = (undefined2)uVar10;
  local_1828._2_2_ = (undefined2)((ulong)uVar10 >> 0x10);
  local_1828._4_2_ = (undefined2)((ulong)uVar10 >> 0x20);
  local_1828._6_2_ = (undefined2)((ulong)uVar10 >> 0x30);
  local_1398 = CONCAT26(local_1828._2_2_,
                        CONCAT24(local_1818._2_2_,
                                 CONCAT22((undefined2)local_1828,(undefined2)local_1818)));
  uStack_1390 = CONCAT26(local_1828._6_2_,
                         CONCAT24(local_1818._6_2_,CONCAT22(local_1828._4_2_,local_1818._4_2_)));
  auVar77._8_8_ = uStack_1390;
  auVar77._0_8_ = local_1398;
  auVar76._8_8_ = uStack_1b30;
  auVar76._0_8_ = local_1b38;
  auVar208 = pmaddwd(auVar77,auVar76);
  local_13b8 = CONCAT26(local_1828._2_2_,
                        CONCAT24(local_1818._2_2_,
                                 CONCAT22((undefined2)local_1828,(undefined2)local_1818)));
  uStack_13b0 = CONCAT26(local_1828._6_2_,
                         CONCAT24(local_1818._6_2_,CONCAT22(local_1828._4_2_,local_1818._4_2_)));
  auVar75._8_8_ = uStack_13b0;
  auVar75._0_8_ = local_13b8;
  auVar74._8_8_ = uStack_1b40;
  auVar74._0_8_ = local_1b48;
  auVar209 = pmaddwd(auVar75,auVar74);
  local_1f38 = auVar208._0_8_;
  uStack_1f30 = auVar208._8_8_;
  local_e98 = local_1f38;
  uVar188 = local_e98;
  uStack_e90 = uStack_1f30;
  uVar189 = uStack_e90;
  local_e98._0_4_ = auVar208._0_4_;
  local_e98._4_4_ = auVar208._4_4_;
  uStack_e90._0_4_ = auVar208._8_4_;
  uStack_e90._4_4_ = auVar208._12_4_;
  local_1f48 = auVar209._0_8_;
  uStack_1f40 = auVar209._8_8_;
  local_eb8 = local_1f48;
  uVar186 = local_eb8;
  uStack_eb0 = uStack_1f40;
  uVar187 = uStack_eb0;
  local_eb8._0_4_ = auVar209._0_4_;
  local_eb8._4_4_ = auVar209._4_4_;
  uStack_eb0._0_4_ = auVar209._8_4_;
  uStack_eb0._4_4_ = auVar209._12_4_;
  local_998 = CONCAT44(local_e98._4_4_ + 0x800,(int)local_e98 + 0x800);
  uStack_990 = CONCAT44(uStack_e90._4_4_ + 0x800,(int)uStack_e90 + 0x800);
  local_99c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_e98 + 0x800 >> auVar208;
  iVar211 = local_e98._4_4_ + 0x800 >> auVar208;
  iVar213 = (int)uStack_e90 + 0x800 >> auVar208;
  iVar215 = uStack_e90._4_4_ + 0x800 >> auVar208;
  local_9b8 = CONCAT44(local_eb8._4_4_ + 0x800,(int)local_eb8 + 0x800);
  uStack_9b0 = CONCAT44(uStack_eb0._4_4_ + 0x800,(int)uStack_eb0 + 0x800);
  local_9bc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_eb8 + 0x800 >> auVar208;
  iVar212 = local_eb8._4_4_ + 0x800 >> auVar208;
  iVar214 = (int)uStack_eb0 + 0x800 >> auVar208;
  iVar216 = uStack_eb0._4_4_ + 0x800 >> auVar208;
  local_498 = CONCAT44(iVar211,iVar206);
  uStack_490 = CONCAT44(iVar215,iVar213);
  local_4a8 = CONCAT44(iVar211,iVar206);
  uStack_4a0 = CONCAT44(iVar215,iVar213);
  auVar157._8_8_ = uStack_490;
  auVar157._0_8_ = local_498;
  auVar156._8_8_ = uStack_4a0;
  auVar156._0_8_ = local_4a8;
  local_1cd8 = packssdw(auVar157,auVar156);
  local_4b8 = CONCAT44(iVar212,iVar207);
  uStack_4b0 = CONCAT44(iVar216,iVar214);
  local_4c8 = CONCAT44(iVar212,iVar207);
  uStack_4c0 = CONCAT44(iVar216,iVar214);
  auVar155._8_8_ = uStack_4b0;
  auVar155._0_8_ = local_4b8;
  auVar154._8_8_ = uStack_4c0;
  auVar154._0_8_ = local_4c8;
  local_1cc8 = packssdw(auVar155,auVar154);
  local_1838._0_2_ = (undefined2)uVar11;
  local_1838._2_2_ = (undefined2)((ulong)uVar11 >> 0x10);
  local_1838._4_2_ = (undefined2)((ulong)uVar11 >> 0x20);
  local_1838._6_2_ = (undefined2)((ulong)uVar11 >> 0x30);
  local_1848._0_2_ = (undefined2)uVar12;
  local_1848._2_2_ = (undefined2)((ulong)uVar12 >> 0x10);
  local_1848._4_2_ = (undefined2)((ulong)uVar12 >> 0x20);
  local_1848._6_2_ = (undefined2)((ulong)uVar12 >> 0x30);
  local_13d8 = CONCAT26(local_1848._2_2_,
                        CONCAT24(local_1838._2_2_,
                                 CONCAT22((undefined2)local_1848,(undefined2)local_1838)));
  uStack_13d0 = CONCAT26(local_1848._6_2_,
                         CONCAT24(local_1838._6_2_,CONCAT22(local_1848._4_2_,local_1838._4_2_)));
  auVar73._8_8_ = uStack_13d0;
  auVar73._0_8_ = local_13d8;
  auVar72._8_8_ = uStack_1b50;
  auVar72._0_8_ = local_1b58;
  auVar208 = pmaddwd(auVar73,auVar72);
  local_13f8 = CONCAT26(local_1848._2_2_,
                        CONCAT24(local_1838._2_2_,
                                 CONCAT22((undefined2)local_1848,(undefined2)local_1838)));
  uStack_13f0 = CONCAT26(local_1848._6_2_,
                         CONCAT24(local_1838._6_2_,CONCAT22(local_1848._4_2_,local_1838._4_2_)));
  auVar71._8_8_ = uStack_13f0;
  auVar71._0_8_ = local_13f8;
  auVar70._8_8_ = uStack_1b60;
  auVar70._0_8_ = local_1b68;
  auVar209 = pmaddwd(auVar71,auVar70);
  local_1fa8 = auVar208._0_8_;
  uStack_1fa0 = auVar208._8_8_;
  local_ed8 = local_1fa8;
  uVar184 = local_ed8;
  uStack_ed0 = uStack_1fa0;
  uVar185 = uStack_ed0;
  local_ed8._0_4_ = auVar208._0_4_;
  local_ed8._4_4_ = auVar208._4_4_;
  uStack_ed0._0_4_ = auVar208._8_4_;
  uStack_ed0._4_4_ = auVar208._12_4_;
  local_1fb8 = auVar209._0_8_;
  uStack_1fb0 = auVar209._8_8_;
  local_ef8 = local_1fb8;
  uVar182 = local_ef8;
  uStack_ef0 = uStack_1fb0;
  uVar183 = uStack_ef0;
  local_ef8._0_4_ = auVar209._0_4_;
  local_ef8._4_4_ = auVar209._4_4_;
  uStack_ef0._0_4_ = auVar209._8_4_;
  uStack_ef0._4_4_ = auVar209._12_4_;
  local_9d8 = CONCAT44(local_ed8._4_4_ + 0x800,(int)local_ed8 + 0x800);
  uStack_9d0 = CONCAT44(uStack_ed0._4_4_ + 0x800,(int)uStack_ed0 + 0x800);
  local_9dc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_ed8 + 0x800 >> auVar208;
  iVar211 = local_ed8._4_4_ + 0x800 >> auVar208;
  iVar213 = (int)uStack_ed0 + 0x800 >> auVar208;
  iVar215 = uStack_ed0._4_4_ + 0x800 >> auVar208;
  local_9f8 = CONCAT44(local_ef8._4_4_ + 0x800,(int)local_ef8 + 0x800);
  uStack_9f0 = CONCAT44(uStack_ef0._4_4_ + 0x800,(int)uStack_ef0 + 0x800);
  local_9fc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_ef8 + 0x800 >> auVar208;
  iVar212 = local_ef8._4_4_ + 0x800 >> auVar208;
  iVar214 = (int)uStack_ef0 + 0x800 >> auVar208;
  iVar216 = uStack_ef0._4_4_ + 0x800 >> auVar208;
  local_4d8 = CONCAT44(iVar211,iVar206);
  uStack_4d0 = CONCAT44(iVar215,iVar213);
  local_4e8 = CONCAT44(iVar211,iVar206);
  uStack_4e0 = CONCAT44(iVar215,iVar213);
  auVar153._8_8_ = uStack_4d0;
  auVar153._0_8_ = local_4d8;
  auVar152._8_8_ = uStack_4e0;
  auVar152._0_8_ = local_4e8;
  local_1cb8 = packssdw(auVar153,auVar152);
  local_4f8 = CONCAT44(iVar212,iVar207);
  uStack_4f0 = CONCAT44(iVar216,iVar214);
  local_508 = CONCAT44(iVar212,iVar207);
  uStack_500 = CONCAT44(iVar216,iVar214);
  auVar151._8_8_ = uStack_4f0;
  auVar151._0_8_ = local_4f8;
  auVar150._8_8_ = uStack_500;
  auVar150._0_8_ = local_508;
  local_1ca8 = packssdw(auVar151,auVar150);
  local_1858._0_2_ = (undefined2)uVar13;
  local_1858._2_2_ = (undefined2)((ulong)uVar13 >> 0x10);
  local_1858._4_2_ = (undefined2)((ulong)uVar13 >> 0x20);
  local_1858._6_2_ = (undefined2)((ulong)uVar13 >> 0x30);
  local_1868._0_2_ = (undefined2)uVar14;
  local_1868._2_2_ = (undefined2)((ulong)uVar14 >> 0x10);
  local_1868._4_2_ = (undefined2)((ulong)uVar14 >> 0x20);
  local_1868._6_2_ = (undefined2)((ulong)uVar14 >> 0x30);
  local_1418 = CONCAT26(local_1868._2_2_,
                        CONCAT24(local_1858._2_2_,
                                 CONCAT22((undefined2)local_1868,(undefined2)local_1858)));
  uStack_1410 = CONCAT26(local_1868._6_2_,
                         CONCAT24(local_1858._6_2_,CONCAT22(local_1868._4_2_,local_1858._4_2_)));
  auVar69._8_8_ = uStack_1410;
  auVar69._0_8_ = local_1418;
  auVar68._8_8_ = uStack_1b70;
  auVar68._0_8_ = local_1b78;
  auVar208 = pmaddwd(auVar69,auVar68);
  local_1438 = CONCAT26(local_1868._2_2_,
                        CONCAT24(local_1858._2_2_,
                                 CONCAT22((undefined2)local_1868,(undefined2)local_1858)));
  uStack_1430 = CONCAT26(local_1868._6_2_,
                         CONCAT24(local_1858._6_2_,CONCAT22(local_1868._4_2_,local_1858._4_2_)));
  auVar67._8_8_ = uStack_1430;
  auVar67._0_8_ = local_1438;
  auVar66._8_8_ = uStack_1b80;
  auVar66._0_8_ = local_1b88;
  auVar209 = pmaddwd(auVar67,auVar66);
  local_2018 = auVar208._0_8_;
  uStack_2010 = auVar208._8_8_;
  local_f18 = local_2018;
  uVar180 = local_f18;
  uStack_f10 = uStack_2010;
  uVar181 = uStack_f10;
  local_f18._0_4_ = auVar208._0_4_;
  local_f18._4_4_ = auVar208._4_4_;
  uStack_f10._0_4_ = auVar208._8_4_;
  uStack_f10._4_4_ = auVar208._12_4_;
  local_2028 = auVar209._0_8_;
  uStack_2020 = auVar209._8_8_;
  local_f38 = local_2028;
  uVar178 = local_f38;
  uStack_f30 = uStack_2020;
  uVar179 = uStack_f30;
  local_f38._0_4_ = auVar209._0_4_;
  local_f38._4_4_ = auVar209._4_4_;
  uStack_f30._0_4_ = auVar209._8_4_;
  uStack_f30._4_4_ = auVar209._12_4_;
  local_a18 = CONCAT44(local_f18._4_4_ + 0x800,(int)local_f18 + 0x800);
  uStack_a10 = CONCAT44(uStack_f10._4_4_ + 0x800,(int)uStack_f10 + 0x800);
  local_a1c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_f18 + 0x800 >> auVar208;
  iVar211 = local_f18._4_4_ + 0x800 >> auVar208;
  iVar213 = (int)uStack_f10 + 0x800 >> auVar208;
  iVar215 = uStack_f10._4_4_ + 0x800 >> auVar208;
  local_a38 = CONCAT44(local_f38._4_4_ + 0x800,(int)local_f38 + 0x800);
  uStack_a30 = CONCAT44(uStack_f30._4_4_ + 0x800,(int)uStack_f30 + 0x800);
  local_a3c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_f38 + 0x800 >> auVar208;
  iVar212 = local_f38._4_4_ + 0x800 >> auVar208;
  iVar214 = (int)uStack_f30 + 0x800 >> auVar208;
  iVar216 = uStack_f30._4_4_ + 0x800 >> auVar208;
  local_518 = CONCAT44(iVar211,iVar206);
  uStack_510 = CONCAT44(iVar215,iVar213);
  local_528 = CONCAT44(iVar211,iVar206);
  uStack_520 = CONCAT44(iVar215,iVar213);
  auVar149._8_8_ = uStack_510;
  auVar149._0_8_ = local_518;
  auVar148._8_8_ = uStack_520;
  auVar148._0_8_ = local_528;
  local_1c98 = packssdw(auVar149,auVar148);
  local_538 = CONCAT44(iVar212,iVar207);
  uStack_530 = CONCAT44(iVar216,iVar214);
  local_548 = CONCAT44(iVar212,iVar207);
  uStack_540 = CONCAT44(iVar216,iVar214);
  auVar147._8_8_ = uStack_530;
  auVar147._0_8_ = local_538;
  auVar146._8_8_ = uStack_540;
  auVar146._0_8_ = local_548;
  local_1c88 = packssdw(auVar147,auVar146);
  local_1878._0_2_ = (undefined2)uVar15;
  local_1878._2_2_ = (undefined2)((ulong)uVar15 >> 0x10);
  local_1878._4_2_ = (undefined2)((ulong)uVar15 >> 0x20);
  local_1878._6_2_ = (undefined2)((ulong)uVar15 >> 0x30);
  local_1888._0_2_ = (undefined2)uVar16;
  local_1888._2_2_ = (undefined2)((ulong)uVar16 >> 0x10);
  local_1888._4_2_ = (undefined2)((ulong)uVar16 >> 0x20);
  local_1888._6_2_ = (undefined2)((ulong)uVar16 >> 0x30);
  local_1458 = CONCAT26(local_1888._2_2_,
                        CONCAT24(local_1878._2_2_,
                                 CONCAT22((undefined2)local_1888,(undefined2)local_1878)));
  uStack_1450 = CONCAT26(local_1888._6_2_,
                         CONCAT24(local_1878._6_2_,CONCAT22(local_1888._4_2_,local_1878._4_2_)));
  auVar65._8_8_ = uStack_1450;
  auVar65._0_8_ = local_1458;
  auVar64._8_8_ = uStack_1b90;
  auVar64._0_8_ = local_1b98;
  auVar208 = pmaddwd(auVar65,auVar64);
  local_1478 = CONCAT26(local_1888._2_2_,
                        CONCAT24(local_1878._2_2_,
                                 CONCAT22((undefined2)local_1888,(undefined2)local_1878)));
  uStack_1470 = CONCAT26(local_1888._6_2_,
                         CONCAT24(local_1878._6_2_,CONCAT22(local_1888._4_2_,local_1878._4_2_)));
  auVar63._8_8_ = uStack_1470;
  auVar63._0_8_ = local_1478;
  auVar62._8_8_ = uStack_1ba0;
  auVar62._0_8_ = local_1ba8;
  auVar209 = pmaddwd(auVar63,auVar62);
  local_2088 = auVar208._0_8_;
  uStack_2080 = auVar208._8_8_;
  local_f58 = local_2088;
  uVar176 = local_f58;
  uStack_f50 = uStack_2080;
  uVar177 = uStack_f50;
  local_f58._0_4_ = auVar208._0_4_;
  local_f58._4_4_ = auVar208._4_4_;
  uStack_f50._0_4_ = auVar208._8_4_;
  uStack_f50._4_4_ = auVar208._12_4_;
  local_2098 = auVar209._0_8_;
  uStack_2090 = auVar209._8_8_;
  local_f78 = local_2098;
  uVar174 = local_f78;
  uStack_f70 = uStack_2090;
  uVar175 = uStack_f70;
  local_f78._0_4_ = auVar209._0_4_;
  local_f78._4_4_ = auVar209._4_4_;
  uStack_f70._0_4_ = auVar209._8_4_;
  uStack_f70._4_4_ = auVar209._12_4_;
  local_a58 = CONCAT44(local_f58._4_4_ + 0x800,(int)local_f58 + 0x800);
  uStack_a50 = CONCAT44(uStack_f50._4_4_ + 0x800,(int)uStack_f50 + 0x800);
  local_a5c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_f58 + 0x800 >> auVar208;
  iVar211 = local_f58._4_4_ + 0x800 >> auVar208;
  iVar213 = (int)uStack_f50 + 0x800 >> auVar208;
  iVar215 = uStack_f50._4_4_ + 0x800 >> auVar208;
  local_a78 = CONCAT44(local_f78._4_4_ + 0x800,(int)local_f78 + 0x800);
  uStack_a70 = CONCAT44(uStack_f70._4_4_ + 0x800,(int)uStack_f70 + 0x800);
  local_a7c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_f78 + 0x800 >> auVar208;
  iVar212 = local_f78._4_4_ + 0x800 >> auVar208;
  iVar214 = (int)uStack_f70 + 0x800 >> auVar208;
  iVar216 = uStack_f70._4_4_ + 0x800 >> auVar208;
  local_558 = CONCAT44(iVar211,iVar206);
  uStack_550 = CONCAT44(iVar215,iVar213);
  local_568 = CONCAT44(iVar211,iVar206);
  uStack_560 = CONCAT44(iVar215,iVar213);
  auVar145._8_8_ = uStack_550;
  auVar145._0_8_ = local_558;
  auVar144._8_8_ = uStack_560;
  auVar144._0_8_ = local_568;
  local_1c78 = packssdw(auVar145,auVar144);
  local_578 = CONCAT44(iVar212,iVar207);
  uStack_570 = CONCAT44(iVar216,iVar214);
  local_588 = CONCAT44(iVar212,iVar207);
  uStack_580 = CONCAT44(iVar216,iVar214);
  auVar143._8_8_ = uStack_570;
  auVar143._0_8_ = local_578;
  auVar142._8_8_ = uStack_580;
  auVar142._0_8_ = local_588;
  local_1c68 = packssdw(auVar143,auVar142);
  local_1888 = uVar16;
  local_1878 = uVar15;
  local_1868 = uVar14;
  local_1858 = uVar13;
  local_1848 = uVar12;
  local_1838 = uVar11;
  local_1828 = uVar10;
  local_1818 = uVar9;
  local_1808 = uVar8;
  local_17f8 = uVar7;
  local_17e8 = uVar6;
  local_17d8 = uVar5;
  local_17c8 = uVar4;
  local_17b8 = uVar3;
  local_17a8 = uVar2;
  local_1798 = uVar1;
  local_1488 = local_1ba8;
  uStack_1480 = uStack_1ba0;
  local_1468 = local_1b98;
  uStack_1460 = uStack_1b90;
  local_1448 = local_1b88;
  uStack_1440 = uStack_1b80;
  local_1428 = local_1b78;
  uStack_1420 = uStack_1b70;
  local_1408 = local_1b68;
  uStack_1400 = uStack_1b60;
  local_13e8 = local_1b58;
  uStack_13e0 = uStack_1b50;
  local_13c8 = local_1b48;
  uStack_13c0 = uStack_1b40;
  local_13a8 = local_1b38;
  uStack_13a0 = uStack_1b30;
  local_1388 = local_1b28;
  uStack_1380 = uStack_1b20;
  local_1368 = local_1b18;
  uStack_1360 = uStack_1b10;
  local_1348 = local_1b08;
  uStack_1340 = uStack_1b00;
  local_1328 = local_1af8;
  uStack_1320 = uStack_1af0;
  local_1308 = local_1ae8;
  uStack_1300 = uStack_1ae0;
  local_12e8 = local_1ad8;
  uStack_12e0 = uStack_1ad0;
  local_12c8 = local_1ac8;
  uStack_12c0 = uStack_1ac0;
  local_12a8 = local_1ab8;
  uStack_12a0 = uStack_1ab0;
  local_f78 = uVar174;
  uStack_f70 = uVar175;
  local_f58 = uVar176;
  uStack_f50 = uVar177;
  local_f38 = uVar178;
  uStack_f30 = uVar179;
  local_f18 = uVar180;
  uStack_f10 = uVar181;
  local_ef8 = uVar182;
  uStack_ef0 = uVar183;
  local_ed8 = uVar184;
  uStack_ed0 = uVar185;
  local_eb8 = uVar186;
  uStack_eb0 = uVar187;
  local_e98 = uVar188;
  uStack_e90 = uVar189;
  local_e78 = uVar190;
  uStack_e70 = uVar191;
  local_e58 = uVar192;
  uStack_e50 = uVar193;
  local_e38 = uVar194;
  uStack_e30 = uVar195;
  local_e18 = uVar196;
  uStack_e10 = uVar197;
  local_df8 = uVar198;
  uStack_df0 = uVar199;
  local_dd8 = uVar200;
  uStack_dd0 = uVar201;
  local_db8 = uVar202;
  uStack_db0 = uVar203;
  local_d98 = uVar204;
  uStack_d90 = uVar205;
  local_368 = local_1ab8;
  uStack_360 = uStack_1ab0;
  local_358 = local_1a10;
  local_354 = local_1a10;
  local_350 = local_1a10;
  local_34c = local_1a10;
  local_348 = local_1ac8;
  uStack_340 = uStack_1ac0;
  local_338 = local_1a14;
  local_334 = local_1a14;
  local_330 = local_1a14;
  local_32c = local_1a14;
  local_328 = local_1ad8;
  uStack_320 = uStack_1ad0;
  local_318 = local_1a18;
  local_314 = local_1a18;
  local_310 = local_1a18;
  local_30c = local_1a18;
  local_308 = local_1ae8;
  uStack_300 = uStack_1ae0;
  local_2f8 = local_1a1c;
  local_2f4 = local_1a1c;
  local_2f0 = local_1a1c;
  local_2ec = local_1a1c;
  local_2e8 = local_1af8;
  uStack_2e0 = uStack_1af0;
  local_2d8 = local_1a20;
  local_2d4 = local_1a20;
  local_2d0 = local_1a20;
  local_2cc = local_1a20;
  local_2c8 = local_1b08;
  uStack_2c0 = uStack_1b00;
  local_2b8 = local_1a24;
  local_2b4 = local_1a24;
  local_2b0 = local_1a24;
  local_2ac = local_1a24;
  local_2a8 = local_1b18;
  uStack_2a0 = uStack_1b10;
  local_298 = local_1a28;
  local_294 = local_1a28;
  local_290 = local_1a28;
  local_28c = local_1a28;
  local_288 = local_1b28;
  uStack_280 = uStack_1b20;
  local_278 = local_1a2c;
  local_274 = local_1a2c;
  local_270 = local_1a2c;
  local_26c = local_1a2c;
  local_268 = local_1b38;
  uStack_260 = uStack_1b30;
  local_258 = local_1a30;
  local_254 = local_1a30;
  local_250 = local_1a30;
  local_24c = local_1a30;
  local_248 = local_1b48;
  uStack_240 = uStack_1b40;
  local_238 = local_1a34;
  local_234 = local_1a34;
  local_230 = local_1a34;
  local_22c = local_1a34;
  local_228 = local_1b58;
  uStack_220 = uStack_1b50;
  local_218 = local_1a38;
  local_214 = local_1a38;
  local_210 = local_1a38;
  local_20c = local_1a38;
  local_208 = local_1b68;
  uStack_200 = uStack_1b60;
  local_1f8 = local_1a3c;
  local_1f4 = local_1a3c;
  local_1f0 = local_1a3c;
  local_1ec = local_1a3c;
  local_1e8 = local_1b78;
  uStack_1e0 = uStack_1b70;
  local_1d8 = local_1a40;
  local_1d4 = local_1a40;
  local_1d0 = local_1a40;
  local_1cc = local_1a40;
  local_1c8 = local_1b88;
  uStack_1c0 = uStack_1b80;
  local_1b8 = local_1a44;
  local_1b4 = local_1a44;
  local_1b0 = local_1a44;
  local_1ac = local_1a44;
  local_1a8 = local_1b98;
  uStack_1a0 = uStack_1b90;
  local_198 = local_1a48;
  local_194 = local_1a48;
  local_190 = local_1a48;
  local_18c = local_1a48;
  local_188 = local_1ba8;
  uStack_180 = uStack_1ba0;
  local_178 = local_1a4c;
  local_174 = local_1a4c;
  local_170 = local_1a4c;
  local_16c = local_1a4c;
  local_168 = local_1bb8;
  uStack_160 = uStack_1bb0;
  local_158 = local_1a50;
  local_154 = local_1a50;
  local_150 = local_1a50;
  local_14c = local_1a50;
  local_148 = local_1bc8;
  uStack_140 = uStack_1bc0;
  local_138 = local_1a54;
  local_134 = local_1a54;
  local_130 = local_1a54;
  local_12c = local_1a54;
  local_128 = local_1bd8;
  uStack_120 = uStack_1bd0;
  local_118 = local_1a58;
  local_114 = local_1a58;
  local_110 = local_1a58;
  local_10c = local_1a58;
  local_108 = local_1be8;
  uStack_100 = uStack_1be0;
  local_f8 = local_1a5c;
  local_f4 = local_1a5c;
  local_f0 = local_1a5c;
  local_ec = local_1a5c;
  local_e8 = local_1bf8;
  uStack_e0 = uStack_1bf0;
  local_d8 = local_1a60;
  local_d4 = local_1a60;
  local_d0 = local_1a60;
  local_cc = local_1a60;
  local_c8 = local_1c08;
  uStack_c0 = uStack_1c00;
  local_b8 = local_1a64;
  local_b4 = local_1a64;
  local_b0 = local_1a64;
  local_ac = local_1a64;
  local_a8 = local_1c18;
  uStack_a0 = uStack_1c10;
  local_98 = local_1a68;
  local_94 = local_1a68;
  local_90 = local_1a68;
  local_8c = local_1a68;
  local_88 = local_1c28;
  uStack_80 = uStack_1c20;
  local_78 = local_1a6c;
  local_74 = local_1a6c;
  local_70 = local_1a6c;
  local_6c = local_1a6c;
  local_68 = local_1c38;
  uStack_60 = uStack_1c30;
  local_58 = local_1a70;
  local_54 = local_1a70;
  local_50 = local_1a70;
  local_4c = local_1a70;
  local_48 = local_1c48;
  uStack_40 = uStack_1c40;
  local_38 = local_1a74;
  local_34 = local_1a74;
  local_30 = local_1a74;
  local_2c = local_1a74;
  local_28 = local_1c58;
  uStack_20 = uStack_1c50;
  local_10 = local_1a78;
  local_c = local_1a78;
  local_8 = local_1a78;
  local_4 = local_1a78;
  local_f88 = local_1aa8;
  iStack_f84 = iStack_1aa4;
  local_f68 = local_1aa8;
  iStack_f64 = iStack_1aa4;
  local_f48 = local_1aa8;
  iStack_f44 = iStack_1aa4;
  local_f28 = local_1aa8;
  iStack_f24 = iStack_1aa4;
  local_f08 = local_1aa8;
  iStack_f04 = iStack_1aa4;
  local_ee8 = local_1aa8;
  iStack_ee4 = iStack_1aa4;
  local_ec8 = local_1aa8;
  iStack_ec4 = iStack_1aa4;
  local_ea8 = local_1aa8;
  iStack_ea4 = iStack_1aa4;
  local_e88 = local_1aa8;
  iStack_e84 = iStack_1aa4;
  local_e68 = local_1aa8;
  iStack_e64 = iStack_1aa4;
  local_e48 = local_1aa8;
  iStack_e44 = iStack_1aa4;
  local_e28 = local_1aa8;
  iStack_e24 = iStack_1aa4;
  local_e08 = local_1aa8;
  iStack_e04 = iStack_1aa4;
  local_de8 = local_1aa8;
  iStack_de4 = iStack_1aa4;
  local_dc8 = local_1aa8;
  iStack_dc4 = iStack_1aa4;
  local_da8 = local_1aa8;
  iStack_da4 = iStack_1aa4;
  local_388 = local_1aa8;
  iStack_384 = iStack_1aa4;
  iStack_f80 = iStack_1aa0;
  iStack_f7c = iStack_1a9c;
  iStack_f60 = iStack_1aa0;
  iStack_f5c = iStack_1a9c;
  iStack_f40 = iStack_1aa0;
  iStack_f3c = iStack_1a9c;
  iStack_f20 = iStack_1aa0;
  iStack_f1c = iStack_1a9c;
  iStack_f00 = iStack_1aa0;
  iStack_efc = iStack_1a9c;
  iStack_ee0 = iStack_1aa0;
  iStack_edc = iStack_1a9c;
  iStack_ec0 = iStack_1aa0;
  iStack_ebc = iStack_1a9c;
  iStack_ea0 = iStack_1aa0;
  iStack_e9c = iStack_1a9c;
  iStack_e80 = iStack_1aa0;
  iStack_e7c = iStack_1a9c;
  iStack_e60 = iStack_1aa0;
  iStack_e5c = iStack_1a9c;
  iStack_e40 = iStack_1aa0;
  iStack_e3c = iStack_1a9c;
  iStack_e20 = iStack_1aa0;
  iStack_e1c = iStack_1a9c;
  iStack_e00 = iStack_1aa0;
  iStack_dfc = iStack_1a9c;
  iStack_de0 = iStack_1aa0;
  iStack_ddc = iStack_1a9c;
  iStack_dc0 = iStack_1aa0;
  iStack_dbc = iStack_1a9c;
  iStack_da0 = iStack_1aa0;
  iStack_d9c = iStack_1a9c;
  iStack_380 = iStack_1aa0;
  iStack_37c = iStack_1a9c;
  iadst16_stage3_ssse3((__m128i *)CONCAT44(in_stack_ffffffffffffda6c,in_stack_ffffffffffffda68));
  local_1898 = local_1cd8._0_8_;
  uVar8 = local_1898;
  uStack_1890 = local_1cd8._8_8_;
  local_18a8 = local_1cc8._0_8_;
  uVar7 = local_18a8;
  uStack_18a0 = local_1cc8._8_8_;
  local_1898._0_2_ = local_1cd8._0_2_;
  local_1898._2_2_ = local_1cd8._2_2_;
  local_1898._4_2_ = local_1cd8._4_2_;
  local_1898._6_2_ = local_1cd8._6_2_;
  local_18a8._0_2_ = local_1cc8._0_2_;
  local_18a8._2_2_ = local_1cc8._2_2_;
  local_18a8._4_2_ = local_1cc8._4_2_;
  local_18a8._6_2_ = local_1cc8._6_2_;
  local_1498 = CONCAT26(local_18a8._2_2_,
                        CONCAT24(local_1898._2_2_,
                                 CONCAT22((undefined2)local_18a8,(undefined2)local_1898)));
  uStack_1490 = CONCAT26(local_18a8._6_2_,
                         CONCAT24(local_1898._6_2_,CONCAT22(local_18a8._4_2_,local_1898._4_2_)));
  local_14a8 = local_1bb8;
  uStack_14a0 = uStack_1bb0;
  auVar61._8_8_ = uStack_1490;
  auVar61._0_8_ = local_1498;
  auVar60._8_8_ = uStack_1bb0;
  auVar60._0_8_ = local_1bb8;
  auVar208 = pmaddwd(auVar61,auVar60);
  local_14b8 = CONCAT26(local_18a8._2_2_,
                        CONCAT24(local_1898._2_2_,
                                 CONCAT22((undefined2)local_18a8,(undefined2)local_1898)));
  uStack_14b0 = CONCAT26(local_18a8._6_2_,
                         CONCAT24(local_1898._6_2_,CONCAT22(local_18a8._4_2_,local_1898._4_2_)));
  local_14c8 = local_1bc8;
  uStack_14c0 = uStack_1bc0;
  auVar59._8_8_ = uStack_14b0;
  auVar59._0_8_ = local_14b8;
  auVar58._8_8_ = uStack_1bc0;
  auVar58._0_8_ = local_1bc8;
  auVar209 = pmaddwd(auVar59,auVar58);
  local_20f8 = auVar208._0_8_;
  uStack_20f0 = auVar208._8_8_;
  local_f98 = local_20f8;
  uVar180 = local_f98;
  uStack_f90 = uStack_20f0;
  uVar181 = uStack_f90;
  local_fa8 = local_1aa8;
  iStack_fa4 = iStack_1aa4;
  iStack_fa0 = iStack_1aa0;
  iStack_f9c = iStack_1a9c;
  local_f98._0_4_ = auVar208._0_4_;
  local_f98._4_4_ = auVar208._4_4_;
  uStack_f90._0_4_ = auVar208._8_4_;
  uStack_f90._4_4_ = auVar208._12_4_;
  local_2108 = auVar209._0_8_;
  uStack_2100 = auVar209._8_8_;
  local_fb8 = local_2108;
  uVar178 = local_fb8;
  uStack_fb0 = uStack_2100;
  uVar179 = uStack_fb0;
  local_fc8 = local_1aa8;
  iStack_fc4 = iStack_1aa4;
  iStack_fc0 = iStack_1aa0;
  iStack_fbc = iStack_1a9c;
  local_fb8._0_4_ = auVar209._0_4_;
  local_fb8._4_4_ = auVar209._4_4_;
  uStack_fb0._0_4_ = auVar209._8_4_;
  uStack_fb0._4_4_ = auVar209._12_4_;
  local_a98 = CONCAT44(local_f98._4_4_ + iStack_1aa4,(int)local_f98 + local_1aa8);
  uStack_a90 = CONCAT44(uStack_f90._4_4_ + iStack_1a9c,(int)uStack_f90 + iStack_1aa0);
  local_a9c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_f98 + local_1aa8 >> auVar208;
  iVar211 = local_f98._4_4_ + iStack_1aa4 >> auVar208;
  iVar213 = (int)uStack_f90 + iStack_1aa0 >> auVar208;
  iVar215 = uStack_f90._4_4_ + iStack_1a9c >> auVar208;
  local_ab8 = CONCAT44(local_fb8._4_4_ + iStack_1aa4,(int)local_fb8 + local_1aa8);
  uStack_ab0 = CONCAT44(uStack_fb0._4_4_ + iStack_1a9c,(int)uStack_fb0 + iStack_1aa0);
  local_abc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_fb8 + local_1aa8 >> auVar208;
  iVar212 = local_fb8._4_4_ + iStack_1aa4 >> auVar208;
  iVar214 = (int)uStack_fb0 + iStack_1aa0 >> auVar208;
  iVar216 = uStack_fb0._4_4_ + iStack_1a9c >> auVar208;
  local_598 = CONCAT44(iVar211,iVar206);
  uStack_590 = CONCAT44(iVar215,iVar213);
  local_5a8 = CONCAT44(iVar211,iVar206);
  uStack_5a0 = CONCAT44(iVar215,iVar213);
  auVar141._8_8_ = uStack_590;
  auVar141._0_8_ = local_598;
  auVar140._8_8_ = uStack_5a0;
  auVar140._0_8_ = local_5a8;
  local_1cd8 = packssdw(auVar141,auVar140);
  local_5b8 = CONCAT44(iVar212,iVar207);
  uStack_5b0 = CONCAT44(iVar216,iVar214);
  local_5c8 = CONCAT44(iVar212,iVar207);
  uStack_5c0 = CONCAT44(iVar216,iVar214);
  auVar139._8_8_ = uStack_5b0;
  auVar139._0_8_ = local_5b8;
  auVar138._8_8_ = uStack_5c0;
  auVar138._0_8_ = local_5c8;
  local_1cc8 = packssdw(auVar139,auVar138);
  local_18b8 = local_1cb8._0_8_;
  uVar6 = local_18b8;
  uStack_18b0 = local_1cb8._8_8_;
  local_18c8 = local_1ca8._0_8_;
  uVar5 = local_18c8;
  uStack_18c0 = local_1ca8._8_8_;
  local_18b8._0_2_ = local_1cb8._0_2_;
  local_18b8._2_2_ = local_1cb8._2_2_;
  local_18b8._4_2_ = local_1cb8._4_2_;
  local_18b8._6_2_ = local_1cb8._6_2_;
  local_18c8._0_2_ = local_1ca8._0_2_;
  local_18c8._2_2_ = local_1ca8._2_2_;
  local_18c8._4_2_ = local_1ca8._4_2_;
  local_18c8._6_2_ = local_1ca8._6_2_;
  local_14d8 = CONCAT26(local_18c8._2_2_,
                        CONCAT24(local_18b8._2_2_,
                                 CONCAT22((undefined2)local_18c8,(undefined2)local_18b8)));
  uStack_14d0 = CONCAT26(local_18c8._6_2_,
                         CONCAT24(local_18b8._6_2_,CONCAT22(local_18c8._4_2_,local_18b8._4_2_)));
  local_14e8 = local_1bd8;
  uStack_14e0 = uStack_1bd0;
  auVar57._8_8_ = uStack_14d0;
  auVar57._0_8_ = local_14d8;
  auVar56._8_8_ = uStack_1bd0;
  auVar56._0_8_ = local_1bd8;
  auVar208 = pmaddwd(auVar57,auVar56);
  local_14f8 = CONCAT26(local_18c8._2_2_,
                        CONCAT24(local_18b8._2_2_,
                                 CONCAT22((undefined2)local_18c8,(undefined2)local_18b8)));
  uStack_14f0 = CONCAT26(local_18c8._6_2_,
                         CONCAT24(local_18b8._6_2_,CONCAT22(local_18c8._4_2_,local_18b8._4_2_)));
  local_1508 = local_1be8;
  uStack_1500 = uStack_1be0;
  auVar55._8_8_ = uStack_14f0;
  auVar55._0_8_ = local_14f8;
  auVar54._8_8_ = uStack_1be0;
  auVar54._0_8_ = local_1be8;
  auVar209 = pmaddwd(auVar55,auVar54);
  local_2168 = auVar208._0_8_;
  uStack_2160 = auVar208._8_8_;
  local_fd8 = local_2168;
  uVar176 = local_fd8;
  uStack_fd0 = uStack_2160;
  uVar177 = uStack_fd0;
  local_fe8 = local_1aa8;
  iStack_fe4 = iStack_1aa4;
  iStack_fe0 = iStack_1aa0;
  iStack_fdc = iStack_1a9c;
  local_fd8._0_4_ = auVar208._0_4_;
  local_fd8._4_4_ = auVar208._4_4_;
  uStack_fd0._0_4_ = auVar208._8_4_;
  uStack_fd0._4_4_ = auVar208._12_4_;
  local_2178 = auVar209._0_8_;
  uStack_2170 = auVar209._8_8_;
  local_ff8 = local_2178;
  uVar174 = local_ff8;
  uStack_ff0 = uStack_2170;
  uVar175 = uStack_ff0;
  local_1008 = local_1aa8;
  iStack_1004 = iStack_1aa4;
  iStack_1000 = iStack_1aa0;
  iStack_ffc = iStack_1a9c;
  local_ff8._0_4_ = auVar209._0_4_;
  local_ff8._4_4_ = auVar209._4_4_;
  uStack_ff0._0_4_ = auVar209._8_4_;
  uStack_ff0._4_4_ = auVar209._12_4_;
  local_ad8 = CONCAT44(local_fd8._4_4_ + iStack_1aa4,(int)local_fd8 + local_1aa8);
  uStack_ad0 = CONCAT44(uStack_fd0._4_4_ + iStack_1a9c,(int)uStack_fd0 + iStack_1aa0);
  local_adc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_fd8 + local_1aa8 >> auVar208;
  iVar211 = local_fd8._4_4_ + iStack_1aa4 >> auVar208;
  iVar213 = (int)uStack_fd0 + iStack_1aa0 >> auVar208;
  iVar215 = uStack_fd0._4_4_ + iStack_1a9c >> auVar208;
  local_af8 = CONCAT44(local_ff8._4_4_ + iStack_1aa4,(int)local_ff8 + local_1aa8);
  uStack_af0 = CONCAT44(uStack_ff0._4_4_ + iStack_1a9c,(int)uStack_ff0 + iStack_1aa0);
  local_afc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_ff8 + local_1aa8 >> auVar208;
  iVar212 = local_ff8._4_4_ + iStack_1aa4 >> auVar208;
  iVar214 = (int)uStack_ff0 + iStack_1aa0 >> auVar208;
  iVar216 = uStack_ff0._4_4_ + iStack_1a9c >> auVar208;
  local_5d8 = CONCAT44(iVar211,iVar206);
  uStack_5d0 = CONCAT44(iVar215,iVar213);
  local_5e8 = CONCAT44(iVar211,iVar206);
  uStack_5e0 = CONCAT44(iVar215,iVar213);
  auVar137._8_8_ = uStack_5d0;
  auVar137._0_8_ = local_5d8;
  auVar136._8_8_ = uStack_5e0;
  auVar136._0_8_ = local_5e8;
  local_1cb8 = packssdw(auVar137,auVar136);
  local_5f8 = CONCAT44(iVar212,iVar207);
  uStack_5f0 = CONCAT44(iVar216,iVar214);
  local_608 = CONCAT44(iVar212,iVar207);
  uStack_600 = CONCAT44(iVar216,iVar214);
  auVar135._8_8_ = uStack_5f0;
  auVar135._0_8_ = local_5f8;
  auVar134._8_8_ = uStack_600;
  auVar134._0_8_ = local_608;
  local_1ca8 = packssdw(auVar135,auVar134);
  local_18d8 = local_1c98._0_8_;
  uVar4 = local_18d8;
  uStack_18d0 = local_1c98._8_8_;
  local_18e8 = local_1c88._0_8_;
  uVar3 = local_18e8;
  uStack_18e0 = local_1c88._8_8_;
  local_18d8._0_2_ = local_1c98._0_2_;
  local_18d8._2_2_ = local_1c98._2_2_;
  local_18d8._4_2_ = local_1c98._4_2_;
  local_18d8._6_2_ = local_1c98._6_2_;
  local_18e8._0_2_ = local_1c88._0_2_;
  local_18e8._2_2_ = local_1c88._2_2_;
  local_18e8._4_2_ = local_1c88._4_2_;
  local_18e8._6_2_ = local_1c88._6_2_;
  local_1518 = CONCAT26(local_18e8._2_2_,
                        CONCAT24(local_18d8._2_2_,
                                 CONCAT22((undefined2)local_18e8,(undefined2)local_18d8)));
  uStack_1510 = CONCAT26(local_18e8._6_2_,
                         CONCAT24(local_18d8._6_2_,CONCAT22(local_18e8._4_2_,local_18d8._4_2_)));
  local_1528 = local_1bf8;
  uStack_1520 = uStack_1bf0;
  auVar53._8_8_ = uStack_1510;
  auVar53._0_8_ = local_1518;
  auVar52._8_8_ = uStack_1bf0;
  auVar52._0_8_ = local_1bf8;
  auVar208 = pmaddwd(auVar53,auVar52);
  local_1538 = CONCAT26(local_18e8._2_2_,
                        CONCAT24(local_18d8._2_2_,
                                 CONCAT22((undefined2)local_18e8,(undefined2)local_18d8)));
  uStack_1530 = CONCAT26(local_18e8._6_2_,
                         CONCAT24(local_18d8._6_2_,CONCAT22(local_18e8._4_2_,local_18d8._4_2_)));
  local_1548 = local_1bb8;
  uStack_1540 = uStack_1bb0;
  auVar51._8_8_ = uStack_1530;
  auVar51._0_8_ = local_1538;
  auVar50._8_8_ = uStack_1bb0;
  auVar50._0_8_ = local_1bb8;
  auVar209 = pmaddwd(auVar51,auVar50);
  local_21d8 = auVar208._0_8_;
  uStack_21d0 = auVar208._8_8_;
  local_1018 = local_21d8;
  uVar15 = local_1018;
  uStack_1010 = uStack_21d0;
  uVar16 = uStack_1010;
  local_1028 = local_1aa8;
  iStack_1024 = iStack_1aa4;
  iStack_1020 = iStack_1aa0;
  iStack_101c = iStack_1a9c;
  local_1018._0_4_ = auVar208._0_4_;
  local_1018._4_4_ = auVar208._4_4_;
  uStack_1010._0_4_ = auVar208._8_4_;
  uStack_1010._4_4_ = auVar208._12_4_;
  local_21e8 = auVar209._0_8_;
  uStack_21e0 = auVar209._8_8_;
  local_1038 = local_21e8;
  uVar13 = local_1038;
  uStack_1030 = uStack_21e0;
  uVar14 = uStack_1030;
  local_1048 = local_1aa8;
  iStack_1044 = iStack_1aa4;
  iStack_1040 = iStack_1aa0;
  iStack_103c = iStack_1a9c;
  local_1038._0_4_ = auVar209._0_4_;
  local_1038._4_4_ = auVar209._4_4_;
  uStack_1030._0_4_ = auVar209._8_4_;
  uStack_1030._4_4_ = auVar209._12_4_;
  local_b18 = CONCAT44(local_1018._4_4_ + iStack_1aa4,(int)local_1018 + local_1aa8);
  uStack_b10 = CONCAT44(uStack_1010._4_4_ + iStack_1a9c,(int)uStack_1010 + iStack_1aa0);
  local_b1c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_1018 + local_1aa8 >> auVar208;
  iVar211 = local_1018._4_4_ + iStack_1aa4 >> auVar208;
  iVar213 = (int)uStack_1010 + iStack_1aa0 >> auVar208;
  iVar215 = uStack_1010._4_4_ + iStack_1a9c >> auVar208;
  local_b38 = CONCAT44(local_1038._4_4_ + iStack_1aa4,(int)local_1038 + local_1aa8);
  uStack_b30 = CONCAT44(uStack_1030._4_4_ + iStack_1a9c,(int)uStack_1030 + iStack_1aa0);
  local_b3c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_1038 + local_1aa8 >> auVar208;
  iVar212 = local_1038._4_4_ + iStack_1aa4 >> auVar208;
  iVar214 = (int)uStack_1030 + iStack_1aa0 >> auVar208;
  iVar216 = uStack_1030._4_4_ + iStack_1a9c >> auVar208;
  local_618 = CONCAT44(iVar211,iVar206);
  uStack_610 = CONCAT44(iVar215,iVar213);
  local_628 = CONCAT44(iVar211,iVar206);
  uStack_620 = CONCAT44(iVar215,iVar213);
  auVar133._8_8_ = uStack_610;
  auVar133._0_8_ = local_618;
  auVar132._8_8_ = uStack_620;
  auVar132._0_8_ = local_628;
  local_1c98 = packssdw(auVar133,auVar132);
  local_638 = CONCAT44(iVar212,iVar207);
  uStack_630 = CONCAT44(iVar216,iVar214);
  local_648 = CONCAT44(iVar212,iVar207);
  uStack_640 = CONCAT44(iVar216,iVar214);
  auVar131._8_8_ = uStack_630;
  auVar131._0_8_ = local_638;
  auVar130._8_8_ = uStack_640;
  auVar130._0_8_ = local_648;
  local_1c88 = packssdw(auVar131,auVar130);
  local_18f8 = local_1c78._0_8_;
  uVar2 = local_18f8;
  uStack_18f0 = local_1c78._8_8_;
  local_1908 = local_1c68._0_8_;
  uVar1 = local_1908;
  uStack_1900 = local_1c68._8_8_;
  local_18f8._0_2_ = local_1c78._0_2_;
  local_18f8._2_2_ = local_1c78._2_2_;
  local_18f8._4_2_ = local_1c78._4_2_;
  local_18f8._6_2_ = local_1c78._6_2_;
  local_1908._0_2_ = local_1c68._0_2_;
  local_1908._2_2_ = local_1c68._2_2_;
  local_1908._4_2_ = local_1c68._4_2_;
  local_1908._6_2_ = local_1c68._6_2_;
  local_1558 = CONCAT26(local_1908._2_2_,
                        CONCAT24(local_18f8._2_2_,
                                 CONCAT22((undefined2)local_1908,(undefined2)local_18f8)));
  uStack_1550 = CONCAT26(local_1908._6_2_,
                         CONCAT24(local_18f8._6_2_,CONCAT22(local_1908._4_2_,local_18f8._4_2_)));
  local_1568 = local_1c08;
  uStack_1560 = uStack_1c00;
  auVar49._8_8_ = uStack_1550;
  auVar49._0_8_ = local_1558;
  auVar48._8_8_ = uStack_1c00;
  auVar48._0_8_ = local_1c08;
  auVar208 = pmaddwd(auVar49,auVar48);
  local_1578 = CONCAT26(local_1908._2_2_,
                        CONCAT24(local_18f8._2_2_,
                                 CONCAT22((undefined2)local_1908,(undefined2)local_18f8)));
  uStack_1570 = CONCAT26(local_1908._6_2_,
                         CONCAT24(local_18f8._6_2_,CONCAT22(local_1908._4_2_,local_18f8._4_2_)));
  local_1588 = local_1bd8;
  uStack_1580 = uStack_1bd0;
  auVar47._8_8_ = uStack_1570;
  auVar47._0_8_ = local_1578;
  auVar46._8_8_ = uStack_1bd0;
  auVar46._0_8_ = local_1bd8;
  auVar209 = pmaddwd(auVar47,auVar46);
  local_2248 = auVar208._0_8_;
  uStack_2240 = auVar208._8_8_;
  local_1058 = local_2248;
  uVar11 = local_1058;
  uStack_1050 = uStack_2240;
  uVar12 = uStack_1050;
  local_1068 = local_1aa8;
  iStack_1064 = iStack_1aa4;
  iStack_1060 = iStack_1aa0;
  iStack_105c = iStack_1a9c;
  local_1058._0_4_ = auVar208._0_4_;
  local_1058._4_4_ = auVar208._4_4_;
  uStack_1050._0_4_ = auVar208._8_4_;
  uStack_1050._4_4_ = auVar208._12_4_;
  local_2258 = auVar209._0_8_;
  uStack_2250 = auVar209._8_8_;
  local_1078 = local_2258;
  uVar9 = local_1078;
  uStack_1070 = uStack_2250;
  uVar10 = uStack_1070;
  local_1088 = local_1aa8;
  iStack_1084 = iStack_1aa4;
  iStack_1080 = iStack_1aa0;
  iStack_107c = iStack_1a9c;
  local_1078._0_4_ = auVar209._0_4_;
  local_1078._4_4_ = auVar209._4_4_;
  uStack_1070._0_4_ = auVar209._8_4_;
  uStack_1070._4_4_ = auVar209._12_4_;
  local_b58 = CONCAT44(local_1058._4_4_ + iStack_1aa4,(int)local_1058 + local_1aa8);
  uStack_b50 = CONCAT44(uStack_1050._4_4_ + iStack_1a9c,(int)uStack_1050 + iStack_1aa0);
  local_b5c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_1058 + local_1aa8 >> auVar208;
  iVar211 = local_1058._4_4_ + iStack_1aa4 >> auVar208;
  iVar213 = (int)uStack_1050 + iStack_1aa0 >> auVar208;
  iVar215 = uStack_1050._4_4_ + iStack_1a9c >> auVar208;
  local_b78 = CONCAT44(local_1078._4_4_ + iStack_1aa4,(int)local_1078 + local_1aa8);
  uStack_b70 = CONCAT44(uStack_1070._4_4_ + iStack_1a9c,(int)uStack_1070 + iStack_1aa0);
  local_b7c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_1078 + local_1aa8 >> auVar208;
  iVar212 = local_1078._4_4_ + iStack_1aa4 >> auVar208;
  iVar214 = (int)uStack_1070 + iStack_1aa0 >> auVar208;
  iVar216 = uStack_1070._4_4_ + iStack_1a9c >> auVar208;
  local_658 = CONCAT44(iVar211,iVar206);
  uStack_650 = CONCAT44(iVar215,iVar213);
  local_668 = CONCAT44(iVar211,iVar206);
  uStack_660 = CONCAT44(iVar215,iVar213);
  auVar129._8_8_ = uStack_650;
  auVar129._0_8_ = local_658;
  auVar128._8_8_ = uStack_660;
  auVar128._0_8_ = local_668;
  local_1c78 = packssdw(auVar129,auVar128);
  local_678 = CONCAT44(iVar212,iVar207);
  uStack_670 = CONCAT44(iVar216,iVar214);
  local_688 = CONCAT44(iVar212,iVar207);
  uStack_680 = CONCAT44(iVar216,iVar214);
  auVar127._8_8_ = uStack_670;
  auVar127._0_8_ = local_678;
  auVar126._8_8_ = uStack_680;
  auVar126._0_8_ = local_688;
  local_1c68 = packssdw(auVar127,auVar126);
  local_1908 = uVar1;
  local_18f8 = uVar2;
  local_18e8 = uVar3;
  local_18d8 = uVar4;
  local_18c8 = uVar5;
  local_18b8 = uVar6;
  local_18a8 = uVar7;
  local_1898 = uVar8;
  local_1078 = uVar9;
  uStack_1070 = uVar10;
  local_1058 = uVar11;
  uStack_1050 = uVar12;
  local_1038 = uVar13;
  uStack_1030 = uVar14;
  local_1018 = uVar15;
  uStack_1010 = uVar16;
  local_ff8 = uVar174;
  uStack_ff0 = uVar175;
  local_fd8 = uVar176;
  uStack_fd0 = uVar177;
  local_fb8 = uVar178;
  uStack_fb0 = uVar179;
  local_f98 = uVar180;
  uStack_f90 = uVar181;
  iadst16_stage5_ssse3((__m128i *)CONCAT44(in_stack_ffffffffffffda6c,in_stack_ffffffffffffda68));
  local_1918 = local_1d18._0_8_;
  uVar8 = local_1918;
  uStack_1910 = local_1d18._8_8_;
  local_1928 = local_1d08._0_8_;
  uVar7 = local_1928;
  uStack_1920 = local_1d08._8_8_;
  local_1918._0_2_ = local_1d18._0_2_;
  local_1918._2_2_ = local_1d18._2_2_;
  local_1918._4_2_ = local_1d18._4_2_;
  local_1918._6_2_ = local_1d18._6_2_;
  local_1928._0_2_ = local_1d08._0_2_;
  local_1928._2_2_ = local_1d08._2_2_;
  local_1928._4_2_ = local_1d08._4_2_;
  local_1928._6_2_ = local_1d08._6_2_;
  local_1598 = CONCAT26(local_1928._2_2_,
                        CONCAT24(local_1918._2_2_,
                                 CONCAT22((undefined2)local_1928,(undefined2)local_1918)));
  uStack_1590 = CONCAT26(local_1928._6_2_,
                         CONCAT24(local_1918._6_2_,CONCAT22(local_1928._4_2_,local_1918._4_2_)));
  local_15a8 = local_1c18;
  uStack_15a0 = uStack_1c10;
  auVar45._8_8_ = uStack_1590;
  auVar45._0_8_ = local_1598;
  auVar44._8_8_ = uStack_1c10;
  auVar44._0_8_ = local_1c18;
  auVar208 = pmaddwd(auVar45,auVar44);
  local_15b8 = CONCAT26(local_1928._2_2_,
                        CONCAT24(local_1918._2_2_,
                                 CONCAT22((undefined2)local_1928,(undefined2)local_1918)));
  uStack_15b0 = CONCAT26(local_1928._6_2_,
                         CONCAT24(local_1918._6_2_,CONCAT22(local_1928._4_2_,local_1918._4_2_)));
  local_15c8 = local_1c28;
  uStack_15c0 = uStack_1c20;
  auVar43._8_8_ = uStack_15b0;
  auVar43._0_8_ = local_15b8;
  auVar42._8_8_ = uStack_1c20;
  auVar42._0_8_ = local_1c28;
  auVar209 = pmaddwd(auVar43,auVar42);
  local_22b8 = auVar208._0_8_;
  uStack_22b0 = auVar208._8_8_;
  local_1098 = local_22b8;
  uVar180 = local_1098;
  uStack_1090 = uStack_22b0;
  uVar181 = uStack_1090;
  local_10a8 = local_1aa8;
  iStack_10a4 = iStack_1aa4;
  iStack_10a0 = iStack_1aa0;
  iStack_109c = iStack_1a9c;
  local_1098._0_4_ = auVar208._0_4_;
  local_1098._4_4_ = auVar208._4_4_;
  uStack_1090._0_4_ = auVar208._8_4_;
  uStack_1090._4_4_ = auVar208._12_4_;
  local_22c8 = auVar209._0_8_;
  uStack_22c0 = auVar209._8_8_;
  local_10b8 = local_22c8;
  uVar178 = local_10b8;
  uStack_10b0 = uStack_22c0;
  uVar179 = uStack_10b0;
  local_10c8 = local_1aa8;
  iStack_10c4 = iStack_1aa4;
  iStack_10c0 = iStack_1aa0;
  iStack_10bc = iStack_1a9c;
  local_10b8._0_4_ = auVar209._0_4_;
  local_10b8._4_4_ = auVar209._4_4_;
  uStack_10b0._0_4_ = auVar209._8_4_;
  uStack_10b0._4_4_ = auVar209._12_4_;
  local_b98 = CONCAT44(local_1098._4_4_ + iStack_1aa4,(int)local_1098 + local_1aa8);
  uStack_b90 = CONCAT44(uStack_1090._4_4_ + iStack_1a9c,(int)uStack_1090 + iStack_1aa0);
  local_b9c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_1098 + local_1aa8 >> auVar208;
  iVar211 = local_1098._4_4_ + iStack_1aa4 >> auVar208;
  iVar213 = (int)uStack_1090 + iStack_1aa0 >> auVar208;
  iVar215 = uStack_1090._4_4_ + iStack_1a9c >> auVar208;
  local_bb8 = CONCAT44(local_10b8._4_4_ + iStack_1aa4,(int)local_10b8 + local_1aa8);
  uStack_bb0 = CONCAT44(uStack_10b0._4_4_ + iStack_1a9c,(int)uStack_10b0 + iStack_1aa0);
  local_bbc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_10b8 + local_1aa8 >> auVar208;
  iVar212 = local_10b8._4_4_ + iStack_1aa4 >> auVar208;
  iVar214 = (int)uStack_10b0 + iStack_1aa0 >> auVar208;
  iVar216 = uStack_10b0._4_4_ + iStack_1a9c >> auVar208;
  local_698 = CONCAT44(iVar211,iVar206);
  uStack_690 = CONCAT44(iVar215,iVar213);
  local_6a8 = CONCAT44(iVar211,iVar206);
  uStack_6a0 = CONCAT44(iVar215,iVar213);
  auVar125._8_8_ = uStack_690;
  auVar125._0_8_ = local_698;
  auVar124._8_8_ = uStack_6a0;
  auVar124._0_8_ = local_6a8;
  local_1d18 = packssdw(auVar125,auVar124);
  local_6b8 = CONCAT44(iVar212,iVar207);
  uStack_6b0 = CONCAT44(iVar216,iVar214);
  local_6c8 = CONCAT44(iVar212,iVar207);
  uStack_6c0 = CONCAT44(iVar216,iVar214);
  auVar123._8_8_ = uStack_6b0;
  auVar123._0_8_ = local_6b8;
  auVar122._8_8_ = uStack_6c0;
  auVar122._0_8_ = local_6c8;
  local_1d08 = packssdw(auVar123,auVar122);
  local_1938 = local_1cf8._0_8_;
  uVar6 = local_1938;
  uStack_1930 = local_1cf8._8_8_;
  local_1948 = local_1ce8._0_8_;
  uVar5 = local_1948;
  uStack_1940 = local_1ce8._8_8_;
  local_1938._0_2_ = local_1cf8._0_2_;
  local_1938._2_2_ = local_1cf8._2_2_;
  local_1938._4_2_ = local_1cf8._4_2_;
  local_1938._6_2_ = local_1cf8._6_2_;
  local_1948._0_2_ = local_1ce8._0_2_;
  local_1948._2_2_ = local_1ce8._2_2_;
  local_1948._4_2_ = local_1ce8._4_2_;
  local_1948._6_2_ = local_1ce8._6_2_;
  local_15d8 = CONCAT26(local_1948._2_2_,
                        CONCAT24(local_1938._2_2_,
                                 CONCAT22((undefined2)local_1948,(undefined2)local_1938)));
  uStack_15d0 = CONCAT26(local_1948._6_2_,
                         CONCAT24(local_1938._6_2_,CONCAT22(local_1948._4_2_,local_1938._4_2_)));
  local_15e8 = local_1c38;
  uStack_15e0 = uStack_1c30;
  auVar41._8_8_ = uStack_15d0;
  auVar41._0_8_ = local_15d8;
  auVar40._8_8_ = uStack_1c30;
  auVar40._0_8_ = local_1c38;
  auVar208 = pmaddwd(auVar41,auVar40);
  local_15f8 = CONCAT26(local_1948._2_2_,
                        CONCAT24(local_1938._2_2_,
                                 CONCAT22((undefined2)local_1948,(undefined2)local_1938)));
  uStack_15f0 = CONCAT26(local_1948._6_2_,
                         CONCAT24(local_1938._6_2_,CONCAT22(local_1948._4_2_,local_1938._4_2_)));
  local_1608 = local_1c18;
  uStack_1600 = uStack_1c10;
  auVar39._8_8_ = uStack_15f0;
  auVar39._0_8_ = local_15f8;
  auVar38._8_8_ = uStack_1c10;
  auVar38._0_8_ = local_1c18;
  auVar209 = pmaddwd(auVar39,auVar38);
  local_2328 = auVar208._0_8_;
  uStack_2320 = auVar208._8_8_;
  local_10d8 = local_2328;
  uVar176 = local_10d8;
  uStack_10d0 = uStack_2320;
  uVar177 = uStack_10d0;
  local_10e8 = local_1aa8;
  iStack_10e4 = iStack_1aa4;
  iStack_10e0 = iStack_1aa0;
  iStack_10dc = iStack_1a9c;
  local_10d8._0_4_ = auVar208._0_4_;
  local_10d8._4_4_ = auVar208._4_4_;
  uStack_10d0._0_4_ = auVar208._8_4_;
  uStack_10d0._4_4_ = auVar208._12_4_;
  local_2338 = auVar209._0_8_;
  uStack_2330 = auVar209._8_8_;
  local_10f8 = local_2338;
  uVar174 = local_10f8;
  uStack_10f0 = uStack_2330;
  uVar175 = uStack_10f0;
  local_1108 = local_1aa8;
  iStack_1104 = iStack_1aa4;
  iStack_1100 = iStack_1aa0;
  iStack_10fc = iStack_1a9c;
  local_10f8._0_4_ = auVar209._0_4_;
  local_10f8._4_4_ = auVar209._4_4_;
  uStack_10f0._0_4_ = auVar209._8_4_;
  uStack_10f0._4_4_ = auVar209._12_4_;
  local_bd8 = CONCAT44(local_10d8._4_4_ + iStack_1aa4,(int)local_10d8 + local_1aa8);
  uStack_bd0 = CONCAT44(uStack_10d0._4_4_ + iStack_1a9c,(int)uStack_10d0 + iStack_1aa0);
  local_bdc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_10d8 + local_1aa8 >> auVar208;
  iVar211 = local_10d8._4_4_ + iStack_1aa4 >> auVar208;
  iVar213 = (int)uStack_10d0 + iStack_1aa0 >> auVar208;
  iVar215 = uStack_10d0._4_4_ + iStack_1a9c >> auVar208;
  local_bf8 = CONCAT44(local_10f8._4_4_ + iStack_1aa4,(int)local_10f8 + local_1aa8);
  uStack_bf0 = CONCAT44(uStack_10f0._4_4_ + iStack_1a9c,(int)uStack_10f0 + iStack_1aa0);
  local_bfc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_10f8 + local_1aa8 >> auVar208;
  iVar212 = local_10f8._4_4_ + iStack_1aa4 >> auVar208;
  iVar214 = (int)uStack_10f0 + iStack_1aa0 >> auVar208;
  iVar216 = uStack_10f0._4_4_ + iStack_1a9c >> auVar208;
  local_6d8 = CONCAT44(iVar211,iVar206);
  uStack_6d0 = CONCAT44(iVar215,iVar213);
  local_6e8 = CONCAT44(iVar211,iVar206);
  uStack_6e0 = CONCAT44(iVar215,iVar213);
  auVar121._8_8_ = uStack_6d0;
  auVar121._0_8_ = local_6d8;
  auVar120._8_8_ = uStack_6e0;
  auVar120._0_8_ = local_6e8;
  local_1cf8 = packssdw(auVar121,auVar120);
  local_6f8 = CONCAT44(iVar212,iVar207);
  uStack_6f0 = CONCAT44(iVar216,iVar214);
  local_708 = CONCAT44(iVar212,iVar207);
  uStack_700 = CONCAT44(iVar216,iVar214);
  auVar119._8_8_ = uStack_6f0;
  auVar119._0_8_ = local_6f8;
  auVar118._8_8_ = uStack_700;
  auVar118._0_8_ = local_708;
  local_1ce8 = packssdw(auVar119,auVar118);
  local_1958 = local_1c98._0_8_;
  uVar4 = local_1958;
  uStack_1950 = local_1c98._8_8_;
  local_1968 = local_1c88._0_8_;
  uVar3 = local_1968;
  uStack_1960 = local_1c88._8_8_;
  local_1958._0_2_ = local_1c98._0_2_;
  local_1958._2_2_ = local_1c98._2_2_;
  local_1958._4_2_ = local_1c98._4_2_;
  local_1958._6_2_ = local_1c98._6_2_;
  local_1968._0_2_ = local_1c88._0_2_;
  local_1968._2_2_ = local_1c88._2_2_;
  local_1968._4_2_ = local_1c88._4_2_;
  local_1968._6_2_ = local_1c88._6_2_;
  local_1618 = CONCAT26(local_1968._2_2_,
                        CONCAT24(local_1958._2_2_,
                                 CONCAT22((undefined2)local_1968,(undefined2)local_1958)));
  uStack_1610 = CONCAT26(local_1968._6_2_,
                         CONCAT24(local_1958._6_2_,CONCAT22(local_1968._4_2_,local_1958._4_2_)));
  local_1628 = local_1c18;
  uStack_1620 = uStack_1c10;
  auVar37._8_8_ = uStack_1610;
  auVar37._0_8_ = local_1618;
  auVar36._8_8_ = uStack_1c10;
  auVar36._0_8_ = local_1c18;
  auVar208 = pmaddwd(auVar37,auVar36);
  local_1638 = CONCAT26(local_1968._2_2_,
                        CONCAT24(local_1958._2_2_,
                                 CONCAT22((undefined2)local_1968,(undefined2)local_1958)));
  uStack_1630 = CONCAT26(local_1968._6_2_,
                         CONCAT24(local_1958._6_2_,CONCAT22(local_1968._4_2_,local_1958._4_2_)));
  local_1648 = local_1c28;
  uStack_1640 = uStack_1c20;
  auVar35._8_8_ = uStack_1630;
  auVar35._0_8_ = local_1638;
  auVar34._8_8_ = uStack_1c20;
  auVar34._0_8_ = local_1c28;
  auVar209 = pmaddwd(auVar35,auVar34);
  local_2398 = auVar208._0_8_;
  uStack_2390 = auVar208._8_8_;
  local_1118 = local_2398;
  uVar15 = local_1118;
  uStack_1110 = uStack_2390;
  uVar16 = uStack_1110;
  local_1128 = local_1aa8;
  iStack_1124 = iStack_1aa4;
  iStack_1120 = iStack_1aa0;
  iStack_111c = iStack_1a9c;
  local_1118._0_4_ = auVar208._0_4_;
  local_1118._4_4_ = auVar208._4_4_;
  uStack_1110._0_4_ = auVar208._8_4_;
  uStack_1110._4_4_ = auVar208._12_4_;
  local_23a8 = auVar209._0_8_;
  uStack_23a0 = auVar209._8_8_;
  local_1138 = local_23a8;
  uVar13 = local_1138;
  uStack_1130 = uStack_23a0;
  uVar14 = uStack_1130;
  local_1148 = local_1aa8;
  iStack_1144 = iStack_1aa4;
  iStack_1140 = iStack_1aa0;
  iStack_113c = iStack_1a9c;
  local_1138._0_4_ = auVar209._0_4_;
  local_1138._4_4_ = auVar209._4_4_;
  uStack_1130._0_4_ = auVar209._8_4_;
  uStack_1130._4_4_ = auVar209._12_4_;
  local_c18 = CONCAT44(local_1118._4_4_ + iStack_1aa4,(int)local_1118 + local_1aa8);
  uStack_c10 = CONCAT44(uStack_1110._4_4_ + iStack_1a9c,(int)uStack_1110 + iStack_1aa0);
  local_c1c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_1118 + local_1aa8 >> auVar208;
  iVar211 = local_1118._4_4_ + iStack_1aa4 >> auVar208;
  iVar213 = (int)uStack_1110 + iStack_1aa0 >> auVar208;
  iVar215 = uStack_1110._4_4_ + iStack_1a9c >> auVar208;
  local_c38 = CONCAT44(local_1138._4_4_ + iStack_1aa4,(int)local_1138 + local_1aa8);
  uStack_c30 = CONCAT44(uStack_1130._4_4_ + iStack_1a9c,(int)uStack_1130 + iStack_1aa0);
  local_c3c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_1138 + local_1aa8 >> auVar208;
  iVar212 = local_1138._4_4_ + iStack_1aa4 >> auVar208;
  iVar214 = (int)uStack_1130 + iStack_1aa0 >> auVar208;
  iVar216 = uStack_1130._4_4_ + iStack_1a9c >> auVar208;
  local_718 = CONCAT44(iVar211,iVar206);
  uStack_710 = CONCAT44(iVar215,iVar213);
  local_728 = CONCAT44(iVar211,iVar206);
  uStack_720 = CONCAT44(iVar215,iVar213);
  auVar117._8_8_ = uStack_710;
  auVar117._0_8_ = local_718;
  auVar116._8_8_ = uStack_720;
  auVar116._0_8_ = local_728;
  local_1c98 = packssdw(auVar117,auVar116);
  local_738 = CONCAT44(iVar212,iVar207);
  uStack_730 = CONCAT44(iVar216,iVar214);
  local_748 = CONCAT44(iVar212,iVar207);
  uStack_740 = CONCAT44(iVar216,iVar214);
  auVar115._8_8_ = uStack_730;
  auVar115._0_8_ = local_738;
  auVar114._8_8_ = uStack_740;
  auVar114._0_8_ = local_748;
  local_1c88 = packssdw(auVar115,auVar114);
  local_1978 = local_1c78._0_8_;
  uVar2 = local_1978;
  uStack_1970 = local_1c78._8_8_;
  local_1988 = local_1c68._0_8_;
  uVar1 = local_1988;
  uStack_1980 = local_1c68._8_8_;
  local_1978._0_2_ = local_1c78._0_2_;
  local_1978._2_2_ = local_1c78._2_2_;
  local_1978._4_2_ = local_1c78._4_2_;
  local_1978._6_2_ = local_1c78._6_2_;
  local_1988._0_2_ = local_1c68._0_2_;
  local_1988._2_2_ = local_1c68._2_2_;
  local_1988._4_2_ = local_1c68._4_2_;
  local_1988._6_2_ = local_1c68._6_2_;
  local_1658 = CONCAT26(local_1988._2_2_,
                        CONCAT24(local_1978._2_2_,
                                 CONCAT22((undefined2)local_1988,(undefined2)local_1978)));
  uStack_1650 = CONCAT26(local_1988._6_2_,
                         CONCAT24(local_1978._6_2_,CONCAT22(local_1988._4_2_,local_1978._4_2_)));
  local_1668 = local_1c38;
  uStack_1660 = uStack_1c30;
  auVar33._8_8_ = uStack_1650;
  auVar33._0_8_ = local_1658;
  auVar32._8_8_ = uStack_1c30;
  auVar32._0_8_ = local_1c38;
  auVar208 = pmaddwd(auVar33,auVar32);
  local_1678 = CONCAT26(local_1988._2_2_,
                        CONCAT24(local_1978._2_2_,
                                 CONCAT22((undefined2)local_1988,(undefined2)local_1978)));
  uStack_1670 = CONCAT26(local_1988._6_2_,
                         CONCAT24(local_1978._6_2_,CONCAT22(local_1988._4_2_,local_1978._4_2_)));
  local_1688 = local_1c18;
  uStack_1680 = uStack_1c10;
  auVar31._8_8_ = uStack_1670;
  auVar31._0_8_ = local_1678;
  auVar30._8_8_ = uStack_1c10;
  auVar30._0_8_ = local_1c18;
  auVar209 = pmaddwd(auVar31,auVar30);
  local_2408 = auVar208._0_8_;
  uStack_2400 = auVar208._8_8_;
  local_1158 = local_2408;
  uVar11 = local_1158;
  uStack_1150 = uStack_2400;
  uVar12 = uStack_1150;
  local_1168 = local_1aa8;
  iStack_1164 = iStack_1aa4;
  iStack_1160 = iStack_1aa0;
  iStack_115c = iStack_1a9c;
  local_1158._0_4_ = auVar208._0_4_;
  local_1158._4_4_ = auVar208._4_4_;
  uStack_1150._0_4_ = auVar208._8_4_;
  uStack_1150._4_4_ = auVar208._12_4_;
  local_2418 = auVar209._0_8_;
  uStack_2410 = auVar209._8_8_;
  local_1178 = local_2418;
  uVar9 = local_1178;
  uStack_1170 = uStack_2410;
  uVar10 = uStack_1170;
  local_1188 = local_1aa8;
  iStack_1184 = iStack_1aa4;
  iStack_1180 = iStack_1aa0;
  iStack_117c = iStack_1a9c;
  local_1178._0_4_ = auVar209._0_4_;
  local_1178._4_4_ = auVar209._4_4_;
  uStack_1170._0_4_ = auVar209._8_4_;
  uStack_1170._4_4_ = auVar209._12_4_;
  local_c58 = CONCAT44(local_1158._4_4_ + iStack_1aa4,(int)local_1158 + local_1aa8);
  uStack_c50 = CONCAT44(uStack_1150._4_4_ + iStack_1a9c,(int)uStack_1150 + iStack_1aa0);
  local_c5c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_1158 + local_1aa8 >> auVar208;
  iVar211 = local_1158._4_4_ + iStack_1aa4 >> auVar208;
  iVar213 = (int)uStack_1150 + iStack_1aa0 >> auVar208;
  iVar215 = uStack_1150._4_4_ + iStack_1a9c >> auVar208;
  local_c78 = CONCAT44(local_1178._4_4_ + iStack_1aa4,(int)local_1178 + local_1aa8);
  uStack_c70 = CONCAT44(uStack_1170._4_4_ + iStack_1a9c,(int)uStack_1170 + iStack_1aa0);
  local_c7c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_1178 + local_1aa8 >> auVar208;
  iVar212 = local_1178._4_4_ + iStack_1aa4 >> auVar208;
  iVar214 = (int)uStack_1170 + iStack_1aa0 >> auVar208;
  iVar216 = uStack_1170._4_4_ + iStack_1a9c >> auVar208;
  local_758 = CONCAT44(iVar211,iVar206);
  uStack_750 = CONCAT44(iVar215,iVar213);
  local_768 = CONCAT44(iVar211,iVar206);
  uStack_760 = CONCAT44(iVar215,iVar213);
  auVar113._8_8_ = uStack_750;
  auVar113._0_8_ = local_758;
  auVar112._8_8_ = uStack_760;
  auVar112._0_8_ = local_768;
  local_1c78 = packssdw(auVar113,auVar112);
  local_778 = CONCAT44(iVar212,iVar207);
  uStack_770 = CONCAT44(iVar216,iVar214);
  local_788 = CONCAT44(iVar212,iVar207);
  uStack_780 = CONCAT44(iVar216,iVar214);
  auVar111._8_8_ = uStack_770;
  auVar111._0_8_ = local_778;
  auVar110._8_8_ = uStack_780;
  auVar110._0_8_ = local_788;
  local_1c68 = packssdw(auVar111,auVar110);
  local_1988 = uVar1;
  local_1978 = uVar2;
  local_1968 = uVar3;
  local_1958 = uVar4;
  local_1948 = uVar5;
  local_1938 = uVar6;
  local_1928 = uVar7;
  local_1918 = uVar8;
  local_1178 = uVar9;
  uStack_1170 = uVar10;
  local_1158 = uVar11;
  uStack_1150 = uVar12;
  local_1138 = uVar13;
  uStack_1130 = uVar14;
  local_1118 = uVar15;
  uStack_1110 = uVar16;
  local_10f8 = uVar174;
  uStack_10f0 = uVar175;
  local_10d8 = uVar176;
  uStack_10d0 = uVar177;
  local_10b8 = uVar178;
  uStack_10b0 = uVar179;
  local_1098 = uVar180;
  uStack_1090 = uVar181;
  iadst16_stage7_ssse3((__m128i *)CONCAT44(in_stack_ffffffffffffda6c,in_stack_ffffffffffffda68));
  local_1998 = local_1d38._0_8_;
  uVar8 = local_1998;
  uStack_1990 = local_1d38._8_8_;
  local_19a8 = local_1d28._0_8_;
  uVar7 = local_19a8;
  uStack_19a0 = local_1d28._8_8_;
  local_1998._0_2_ = local_1d38._0_2_;
  local_1998._2_2_ = local_1d38._2_2_;
  local_1998._4_2_ = local_1d38._4_2_;
  local_1998._6_2_ = local_1d38._6_2_;
  local_19a8._0_2_ = local_1d28._0_2_;
  local_19a8._2_2_ = local_1d28._2_2_;
  local_19a8._4_2_ = local_1d28._4_2_;
  local_19a8._6_2_ = local_1d28._6_2_;
  local_1698 = CONCAT26(local_19a8._2_2_,
                        CONCAT24(local_1998._2_2_,
                                 CONCAT22((undefined2)local_19a8,(undefined2)local_1998)));
  uStack_1690 = CONCAT26(local_19a8._6_2_,
                         CONCAT24(local_1998._6_2_,CONCAT22(local_19a8._4_2_,local_1998._4_2_)));
  local_16a8 = local_1c48;
  uStack_16a0 = uStack_1c40;
  auVar29._8_8_ = uStack_1690;
  auVar29._0_8_ = local_1698;
  auVar28._8_8_ = uStack_1c40;
  auVar28._0_8_ = local_1c48;
  auVar208 = pmaddwd(auVar29,auVar28);
  local_16b8 = CONCAT26(local_19a8._2_2_,
                        CONCAT24(local_1998._2_2_,
                                 CONCAT22((undefined2)local_19a8,(undefined2)local_1998)));
  uStack_16b0 = CONCAT26(local_19a8._6_2_,
                         CONCAT24(local_1998._6_2_,CONCAT22(local_19a8._4_2_,local_1998._4_2_)));
  local_16c8 = local_1c58;
  uStack_16c0 = uStack_1c50;
  auVar27._8_8_ = uStack_16b0;
  auVar27._0_8_ = local_16b8;
  auVar26._8_8_ = uStack_1c50;
  auVar26._0_8_ = local_1c58;
  auVar209 = pmaddwd(auVar27,auVar26);
  local_2478 = auVar208._0_8_;
  uStack_2470 = auVar208._8_8_;
  local_1198 = local_2478;
  uVar180 = local_1198;
  uStack_1190 = uStack_2470;
  uVar181 = uStack_1190;
  local_11a8 = local_1aa8;
  iStack_11a4 = iStack_1aa4;
  iStack_11a0 = iStack_1aa0;
  iStack_119c = iStack_1a9c;
  local_1198._0_4_ = auVar208._0_4_;
  local_1198._4_4_ = auVar208._4_4_;
  uStack_1190._0_4_ = auVar208._8_4_;
  uStack_1190._4_4_ = auVar208._12_4_;
  local_2488 = auVar209._0_8_;
  uStack_2480 = auVar209._8_8_;
  local_11b8 = local_2488;
  uVar178 = local_11b8;
  uStack_11b0 = uStack_2480;
  uVar179 = uStack_11b0;
  local_11c8 = local_1aa8;
  iStack_11c4 = iStack_1aa4;
  iStack_11c0 = iStack_1aa0;
  iStack_11bc = iStack_1a9c;
  local_11b8._0_4_ = auVar209._0_4_;
  local_11b8._4_4_ = auVar209._4_4_;
  uStack_11b0._0_4_ = auVar209._8_4_;
  uStack_11b0._4_4_ = auVar209._12_4_;
  local_c98 = CONCAT44(local_1198._4_4_ + iStack_1aa4,(int)local_1198 + local_1aa8);
  uStack_c90 = CONCAT44(uStack_1190._4_4_ + iStack_1a9c,(int)uStack_1190 + iStack_1aa0);
  local_c9c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_1198 + local_1aa8 >> auVar208;
  iVar211 = local_1198._4_4_ + iStack_1aa4 >> auVar208;
  iVar213 = (int)uStack_1190 + iStack_1aa0 >> auVar208;
  iVar215 = uStack_1190._4_4_ + iStack_1a9c >> auVar208;
  local_cb8 = CONCAT44(local_11b8._4_4_ + iStack_1aa4,(int)local_11b8 + local_1aa8);
  uStack_cb0 = CONCAT44(uStack_11b0._4_4_ + iStack_1a9c,(int)uStack_11b0 + iStack_1aa0);
  local_cbc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_11b8 + local_1aa8 >> auVar208;
  iVar212 = local_11b8._4_4_ + iStack_1aa4 >> auVar208;
  iVar214 = (int)uStack_11b0 + iStack_1aa0 >> auVar208;
  iVar216 = uStack_11b0._4_4_ + iStack_1a9c >> auVar208;
  local_798 = CONCAT44(iVar211,iVar206);
  uStack_790 = CONCAT44(iVar215,iVar213);
  local_7a8 = CONCAT44(iVar211,iVar206);
  uStack_7a0 = CONCAT44(iVar215,iVar213);
  auVar109._8_8_ = uStack_790;
  auVar109._0_8_ = local_798;
  auVar108._8_8_ = uStack_7a0;
  auVar108._0_8_ = local_7a8;
  local_1d38 = packssdw(auVar109,auVar108);
  local_7b8 = CONCAT44(iVar212,iVar207);
  uStack_7b0 = CONCAT44(iVar216,iVar214);
  local_7c8 = CONCAT44(iVar212,iVar207);
  uStack_7c0 = CONCAT44(iVar216,iVar214);
  auVar107._8_8_ = uStack_7b0;
  auVar107._0_8_ = local_7b8;
  auVar106._8_8_ = uStack_7c0;
  auVar106._0_8_ = local_7c8;
  local_1d28 = packssdw(auVar107,auVar106);
  local_19b8 = local_1cf8._0_8_;
  uVar6 = local_19b8;
  uStack_19b0 = local_1cf8._8_8_;
  local_19c8 = local_1ce8._0_8_;
  uVar5 = local_19c8;
  uStack_19c0 = local_1ce8._8_8_;
  local_19b8._0_2_ = local_1cf8._0_2_;
  local_19b8._2_2_ = local_1cf8._2_2_;
  local_19b8._4_2_ = local_1cf8._4_2_;
  local_19b8._6_2_ = local_1cf8._6_2_;
  local_19c8._0_2_ = local_1ce8._0_2_;
  local_19c8._2_2_ = local_1ce8._2_2_;
  local_19c8._4_2_ = local_1ce8._4_2_;
  local_19c8._6_2_ = local_1ce8._6_2_;
  local_16d8 = CONCAT26(local_19c8._2_2_,
                        CONCAT24(local_19b8._2_2_,
                                 CONCAT22((undefined2)local_19c8,(undefined2)local_19b8)));
  uStack_16d0 = CONCAT26(local_19c8._6_2_,
                         CONCAT24(local_19b8._6_2_,CONCAT22(local_19c8._4_2_,local_19b8._4_2_)));
  local_16e8 = local_1c48;
  uStack_16e0 = uStack_1c40;
  auVar25._8_8_ = uStack_16d0;
  auVar25._0_8_ = local_16d8;
  auVar24._8_8_ = uStack_1c40;
  auVar24._0_8_ = local_1c48;
  auVar208 = pmaddwd(auVar25,auVar24);
  local_16f8 = CONCAT26(local_19c8._2_2_,
                        CONCAT24(local_19b8._2_2_,
                                 CONCAT22((undefined2)local_19c8,(undefined2)local_19b8)));
  uStack_16f0 = CONCAT26(local_19c8._6_2_,
                         CONCAT24(local_19b8._6_2_,CONCAT22(local_19c8._4_2_,local_19b8._4_2_)));
  local_1708 = local_1c58;
  uStack_1700 = uStack_1c50;
  auVar23._8_8_ = uStack_16f0;
  auVar23._0_8_ = local_16f8;
  auVar22._8_8_ = uStack_1c50;
  auVar22._0_8_ = local_1c58;
  auVar209 = pmaddwd(auVar23,auVar22);
  local_24e8 = auVar208._0_8_;
  uStack_24e0 = auVar208._8_8_;
  local_11d8 = local_24e8;
  uVar176 = local_11d8;
  uStack_11d0 = uStack_24e0;
  uVar177 = uStack_11d0;
  local_11e8 = local_1aa8;
  iStack_11e4 = iStack_1aa4;
  iStack_11e0 = iStack_1aa0;
  iStack_11dc = iStack_1a9c;
  local_11d8._0_4_ = auVar208._0_4_;
  local_11d8._4_4_ = auVar208._4_4_;
  uStack_11d0._0_4_ = auVar208._8_4_;
  uStack_11d0._4_4_ = auVar208._12_4_;
  local_24f8 = auVar209._0_8_;
  uStack_24f0 = auVar209._8_8_;
  local_11f8 = local_24f8;
  uVar174 = local_11f8;
  uStack_11f0 = uStack_24f0;
  uVar175 = uStack_11f0;
  local_1208 = local_1aa8;
  iStack_1204 = iStack_1aa4;
  iStack_1200 = iStack_1aa0;
  iStack_11fc = iStack_1a9c;
  local_11f8._0_4_ = auVar209._0_4_;
  local_11f8._4_4_ = auVar209._4_4_;
  uStack_11f0._0_4_ = auVar209._8_4_;
  uStack_11f0._4_4_ = auVar209._12_4_;
  local_cd8 = CONCAT44(local_11d8._4_4_ + iStack_1aa4,(int)local_11d8 + local_1aa8);
  uStack_cd0 = CONCAT44(uStack_11d0._4_4_ + iStack_1a9c,(int)uStack_11d0 + iStack_1aa0);
  local_cdc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_11d8 + local_1aa8 >> auVar208;
  iVar211 = local_11d8._4_4_ + iStack_1aa4 >> auVar208;
  iVar213 = (int)uStack_11d0 + iStack_1aa0 >> auVar208;
  iVar215 = uStack_11d0._4_4_ + iStack_1a9c >> auVar208;
  local_cf8 = CONCAT44(local_11f8._4_4_ + iStack_1aa4,(int)local_11f8 + local_1aa8);
  uStack_cf0 = CONCAT44(uStack_11f0._4_4_ + iStack_1a9c,(int)uStack_11f0 + iStack_1aa0);
  local_cfc = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_11f8 + local_1aa8 >> auVar208;
  iVar212 = local_11f8._4_4_ + iStack_1aa4 >> auVar208;
  iVar214 = (int)uStack_11f0 + iStack_1aa0 >> auVar208;
  iVar216 = uStack_11f0._4_4_ + iStack_1a9c >> auVar208;
  local_7d8 = CONCAT44(iVar211,iVar206);
  uStack_7d0 = CONCAT44(iVar215,iVar213);
  local_7e8 = CONCAT44(iVar211,iVar206);
  uStack_7e0 = CONCAT44(iVar215,iVar213);
  auVar105._8_8_ = uStack_7d0;
  auVar105._0_8_ = local_7d8;
  auVar104._8_8_ = uStack_7e0;
  auVar104._0_8_ = local_7e8;
  local_1cf8 = packssdw(auVar105,auVar104);
  local_7f8 = CONCAT44(iVar212,iVar207);
  uStack_7f0 = CONCAT44(iVar216,iVar214);
  local_808 = CONCAT44(iVar212,iVar207);
  uStack_800 = CONCAT44(iVar216,iVar214);
  auVar103._8_8_ = uStack_7f0;
  auVar103._0_8_ = local_7f8;
  auVar102._8_8_ = uStack_800;
  auVar102._0_8_ = local_808;
  local_1ce8 = packssdw(auVar103,auVar102);
  local_19d8 = local_1cb8._0_8_;
  uVar4 = local_19d8;
  uStack_19d0 = local_1cb8._8_8_;
  local_19e8 = local_1ca8._0_8_;
  uVar3 = local_19e8;
  uStack_19e0 = local_1ca8._8_8_;
  local_19d8._0_2_ = local_1cb8._0_2_;
  local_19d8._2_2_ = local_1cb8._2_2_;
  local_19d8._4_2_ = local_1cb8._4_2_;
  local_19d8._6_2_ = local_1cb8._6_2_;
  local_19e8._0_2_ = local_1ca8._0_2_;
  local_19e8._2_2_ = local_1ca8._2_2_;
  local_19e8._4_2_ = local_1ca8._4_2_;
  local_19e8._6_2_ = local_1ca8._6_2_;
  local_1718 = CONCAT26(local_19e8._2_2_,
                        CONCAT24(local_19d8._2_2_,
                                 CONCAT22((undefined2)local_19e8,(undefined2)local_19d8)));
  uStack_1710 = CONCAT26(local_19e8._6_2_,
                         CONCAT24(local_19d8._6_2_,CONCAT22(local_19e8._4_2_,local_19d8._4_2_)));
  local_1728 = local_1c48;
  uStack_1720 = uStack_1c40;
  auVar21._8_8_ = uStack_1710;
  auVar21._0_8_ = local_1718;
  auVar20._8_8_ = uStack_1c40;
  auVar20._0_8_ = local_1c48;
  auVar208 = pmaddwd(auVar21,auVar20);
  local_1738 = CONCAT26(local_19e8._2_2_,
                        CONCAT24(local_19d8._2_2_,
                                 CONCAT22((undefined2)local_19e8,(undefined2)local_19d8)));
  uStack_1730 = CONCAT26(local_19e8._6_2_,
                         CONCAT24(local_19d8._6_2_,CONCAT22(local_19e8._4_2_,local_19d8._4_2_)));
  local_1748 = local_1c58;
  uStack_1740 = uStack_1c50;
  auVar19._8_8_ = uStack_1730;
  auVar19._0_8_ = local_1738;
  auVar18._8_8_ = uStack_1c50;
  auVar18._0_8_ = local_1c58;
  auVar209 = pmaddwd(auVar19,auVar18);
  local_2558 = auVar208._0_8_;
  uStack_2550 = auVar208._8_8_;
  local_1218 = local_2558;
  uVar15 = local_1218;
  uStack_1210 = uStack_2550;
  uVar16 = uStack_1210;
  local_1228 = local_1aa8;
  iStack_1224 = iStack_1aa4;
  iStack_1220 = iStack_1aa0;
  iStack_121c = iStack_1a9c;
  local_1218._0_4_ = auVar208._0_4_;
  local_1218._4_4_ = auVar208._4_4_;
  uStack_1210._0_4_ = auVar208._8_4_;
  uStack_1210._4_4_ = auVar208._12_4_;
  local_2568 = auVar209._0_8_;
  uStack_2560 = auVar209._8_8_;
  local_1238 = local_2568;
  uVar13 = local_1238;
  uStack_1230 = uStack_2560;
  uVar14 = uStack_1230;
  local_1248 = local_1aa8;
  iStack_1244 = iStack_1aa4;
  iStack_1240 = iStack_1aa0;
  iStack_123c = iStack_1a9c;
  local_1238._0_4_ = auVar209._0_4_;
  local_1238._4_4_ = auVar209._4_4_;
  uStack_1230._0_4_ = auVar209._8_4_;
  uStack_1230._4_4_ = auVar209._12_4_;
  local_d18 = CONCAT44(local_1218._4_4_ + iStack_1aa4,(int)local_1218 + local_1aa8);
  uStack_d10 = CONCAT44(uStack_1210._4_4_ + iStack_1a9c,(int)uStack_1210 + iStack_1aa0);
  local_d1c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_1218 + local_1aa8 >> auVar208;
  iVar211 = local_1218._4_4_ + iStack_1aa4 >> auVar208;
  iVar213 = (int)uStack_1210 + iStack_1aa0 >> auVar208;
  iVar215 = uStack_1210._4_4_ + iStack_1a9c >> auVar208;
  local_d38 = CONCAT44(local_1238._4_4_ + iStack_1aa4,(int)local_1238 + local_1aa8);
  uStack_d30 = CONCAT44(uStack_1230._4_4_ + iStack_1a9c,(int)uStack_1230 + iStack_1aa0);
  local_d3c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_1238 + local_1aa8 >> auVar208;
  iVar212 = local_1238._4_4_ + iStack_1aa4 >> auVar208;
  iVar214 = (int)uStack_1230 + iStack_1aa0 >> auVar208;
  iVar216 = uStack_1230._4_4_ + iStack_1a9c >> auVar208;
  local_818 = CONCAT44(iVar211,iVar206);
  uStack_810 = CONCAT44(iVar215,iVar213);
  local_828 = CONCAT44(iVar211,iVar206);
  uStack_820 = CONCAT44(iVar215,iVar213);
  auVar101._8_8_ = uStack_810;
  auVar101._0_8_ = local_818;
  auVar100._8_8_ = uStack_820;
  auVar100._0_8_ = local_828;
  local_1cb8 = packssdw(auVar101,auVar100);
  local_838 = CONCAT44(iVar212,iVar207);
  uStack_830 = CONCAT44(iVar216,iVar214);
  local_848 = CONCAT44(iVar212,iVar207);
  uStack_840 = CONCAT44(iVar216,iVar214);
  auVar99._8_8_ = uStack_830;
  auVar99._0_8_ = local_838;
  auVar98._8_8_ = uStack_840;
  auVar98._0_8_ = local_848;
  local_1ca8 = packssdw(auVar99,auVar98);
  local_19f8 = local_1c78._0_8_;
  uVar2 = local_19f8;
  uStack_19f0 = local_1c78._8_8_;
  local_1a08 = local_1c68._0_8_;
  uVar1 = local_1a08;
  uStack_1a00 = local_1c68._8_8_;
  local_19f8._0_2_ = local_1c78._0_2_;
  local_19f8._2_2_ = local_1c78._2_2_;
  local_19f8._4_2_ = local_1c78._4_2_;
  local_19f8._6_2_ = local_1c78._6_2_;
  local_1a08._0_2_ = local_1c68._0_2_;
  local_1a08._2_2_ = local_1c68._2_2_;
  local_1a08._4_2_ = local_1c68._4_2_;
  local_1a08._6_2_ = local_1c68._6_2_;
  local_1758 = CONCAT26(local_1a08._2_2_,
                        CONCAT24(local_19f8._2_2_,
                                 CONCAT22((undefined2)local_1a08,(undefined2)local_19f8)));
  uStack_1750 = CONCAT26(local_1a08._6_2_,
                         CONCAT24(local_19f8._6_2_,CONCAT22(local_1a08._4_2_,local_19f8._4_2_)));
  local_1768 = local_1c48;
  uStack_1760 = uStack_1c40;
  auVar17._8_8_ = uStack_1750;
  auVar17._0_8_ = local_1758;
  auVar210._8_8_ = uStack_1c40;
  auVar210._0_8_ = local_1c48;
  auVar210 = pmaddwd(auVar17,auVar210);
  local_1778 = CONCAT26(local_1a08._2_2_,
                        CONCAT24(local_19f8._2_2_,
                                 CONCAT22((undefined2)local_1a08,(undefined2)local_19f8)));
  uStack_1770 = CONCAT26(local_1a08._6_2_,
                         CONCAT24(local_19f8._6_2_,CONCAT22(local_1a08._4_2_,local_19f8._4_2_)));
  local_1788 = local_1c58;
  uStack_1780 = uStack_1c50;
  auVar209._8_8_ = uStack_1770;
  auVar209._0_8_ = local_1778;
  auVar208._8_8_ = uStack_1c50;
  auVar208._0_8_ = local_1c58;
  auVar208 = pmaddwd(auVar209,auVar208);
  local_25c8 = auVar210._0_8_;
  uStackY_25c0 = auVar210._8_8_;
  local_1258 = local_25c8;
  uVar11 = local_1258;
  uStack_1250 = uStackY_25c0;
  uVar12 = uStack_1250;
  local_1268 = local_1aa8;
  iStack_1264 = iStack_1aa4;
  iStack_1260 = iStack_1aa0;
  iStack_125c = iStack_1a9c;
  local_1258._0_4_ = auVar210._0_4_;
  local_1258._4_4_ = auVar210._4_4_;
  uStack_1250._0_4_ = auVar210._8_4_;
  uStack_1250._4_4_ = auVar210._12_4_;
  local_25d8 = auVar208._0_8_;
  uStackY_25d0 = auVar208._8_8_;
  local_1278 = local_25d8;
  uVar9 = local_1278;
  uStack_1270 = uStackY_25d0;
  uVar10 = uStack_1270;
  local_1288 = local_1aa8;
  iStack_1284 = iStack_1aa4;
  iStack_1280 = iStack_1aa0;
  iStack_127c = iStack_1a9c;
  local_1278._0_4_ = auVar208._0_4_;
  local_1278._4_4_ = auVar208._4_4_;
  uStack_1270._0_4_ = auVar208._8_4_;
  uStack_1270._4_4_ = auVar208._12_4_;
  local_d58 = CONCAT44(local_1258._4_4_ + iStack_1aa4,(int)local_1258 + local_1aa8);
  uStack_d50 = CONCAT44(uStack_1250._4_4_ + iStack_1a9c,(int)uStack_1250 + iStack_1aa0);
  local_d5c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar206 = (int)local_1258 + local_1aa8 >> auVar208;
  iVar211 = local_1258._4_4_ + iStack_1aa4 >> auVar208;
  iVar213 = (int)uStack_1250 + iStack_1aa0 >> auVar208;
  iVar215 = uStack_1250._4_4_ + iStack_1a9c >> auVar208;
  local_d78 = CONCAT44(local_1278._4_4_ + iStack_1aa4,(int)local_1278 + local_1aa8);
  uStack_d70 = CONCAT44(uStack_1270._4_4_ + iStack_1a9c,(int)uStack_1270 + iStack_1aa0);
  local_d7c = 0xc;
  auVar208 = ZEXT416(0xc);
  iVar207 = (int)local_1278 + local_1aa8 >> auVar208;
  iVar212 = local_1278._4_4_ + iStack_1aa4 >> auVar208;
  iVar214 = (int)uStack_1270 + iStack_1aa0 >> auVar208;
  iVar216 = uStack_1270._4_4_ + iStack_1a9c >> auVar208;
  local_858 = CONCAT44(iVar211,iVar206);
  uStack_850 = CONCAT44(iVar215,iVar213);
  local_868 = CONCAT44(iVar211,iVar206);
  uStack_860 = CONCAT44(iVar215,iVar213);
  auVar97._8_8_ = uStack_850;
  auVar97._0_8_ = local_858;
  auVar96._8_8_ = uStack_860;
  auVar96._0_8_ = local_868;
  local_1c78 = packssdw(auVar97,auVar96);
  local_878 = CONCAT44(iVar212,iVar207);
  uStack_870 = CONCAT44(iVar216,iVar214);
  local_888 = CONCAT44(iVar212,iVar207);
  uStack_880 = CONCAT44(iVar216,iVar214);
  auVar95._8_8_ = uStack_870;
  auVar95._0_8_ = local_878;
  auVar94._8_8_ = uStack_880;
  auVar94._0_8_ = local_888;
  local_1c68 = packssdw(auVar95,auVar94);
  local_1a08 = uVar1;
  local_19f8 = uVar2;
  local_19e8 = uVar3;
  local_19d8 = uVar4;
  local_19c8 = uVar5;
  local_19b8 = uVar6;
  local_19a8 = uVar7;
  local_1998 = uVar8;
  local_1278 = uVar9;
  uStack_1270 = uVar10;
  local_1258 = uVar11;
  uStack_1250 = uVar12;
  local_1238 = uVar13;
  uStack_1230 = uVar14;
  local_1218 = uVar15;
  uStack_1210 = uVar16;
  local_11f8 = uVar174;
  uStack_11f0 = uVar175;
  local_11d8 = uVar176;
  uStack_11d0 = uVar177;
  local_11b8 = uVar178;
  uStack_11b0 = uVar179;
  local_1198 = uVar180;
  uStack_1190 = uVar181;
  iadst16_stage9_ssse3(local_1a88,&local_1d58);
  return;
}

Assistant:

static void iadst16_w4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  const __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  const __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  const __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  const __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  const __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  const __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  const __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  const __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  const __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  const __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  const __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  const __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  const __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  const __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  const __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_m56_p08 = pair_set_epi16(-cospi[56], cospi[8]);
  const __m128i cospi_m24_p40 = pair_set_epi16(-cospi[24], cospi[40]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);

  // stage 1
  __m128i x[16];
  x[0] = input[15];
  x[1] = input[0];
  x[2] = input[13];
  x[3] = input[2];
  x[4] = input[11];
  x[5] = input[4];
  x[6] = input[9];
  x[7] = input[6];
  x[8] = input[7];
  x[9] = input[8];
  x[10] = input[5];
  x[11] = input[10];
  x[12] = input[3];
  x[13] = input[12];
  x[14] = input[1];
  x[15] = input[14];

  // stage 2
  btf_16_4p_sse2(cospi_p02_p62, cospi_p62_m02, x[0], x[1], x[0], x[1]);
  btf_16_4p_sse2(cospi_p10_p54, cospi_p54_m10, x[2], x[3], x[2], x[3]);
  btf_16_4p_sse2(cospi_p18_p46, cospi_p46_m18, x[4], x[5], x[4], x[5]);
  btf_16_4p_sse2(cospi_p26_p38, cospi_p38_m26, x[6], x[7], x[6], x[7]);
  btf_16_4p_sse2(cospi_p34_p30, cospi_p30_m34, x[8], x[9], x[8], x[9]);
  btf_16_4p_sse2(cospi_p42_p22, cospi_p22_m42, x[10], x[11], x[10], x[11]);
  btf_16_4p_sse2(cospi_p50_p14, cospi_p14_m50, x[12], x[13], x[12], x[13]);
  btf_16_4p_sse2(cospi_p58_p06, cospi_p06_m58, x[14], x[15], x[14], x[15]);

  // stage 3
  iadst16_stage3_ssse3(x);

  // stage 4
  btf_16_4p_sse2(cospi_p08_p56, cospi_p56_m08, x[8], x[9], x[8], x[9]);
  btf_16_4p_sse2(cospi_p40_p24, cospi_p24_m40, x[10], x[11], x[10], x[11]);
  btf_16_4p_sse2(cospi_m56_p08, cospi_p08_p56, x[12], x[13], x[12], x[13]);
  btf_16_4p_sse2(cospi_m24_p40, cospi_p40_p24, x[14], x[15], x[14], x[15]);

  // stage 5
  iadst16_stage5_ssse3(x);

  // stage 6
  btf_16_4p_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);
  btf_16_4p_sse2(cospi_m48_p16, cospi_p16_p48, x[6], x[7], x[6], x[7]);
  btf_16_4p_sse2(cospi_p16_p48, cospi_p48_m16, x[12], x[13], x[12], x[13]);
  btf_16_4p_sse2(cospi_m48_p16, cospi_p16_p48, x[14], x[15], x[14], x[15]);

  // stage 7
  iadst16_stage7_ssse3(x);

  // stage 8
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[2], x[3], x[2], x[3]);
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[6], x[7], x[6], x[7]);
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[10], x[11], x[10], x[11]);
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[14], x[15], x[14], x[15]);

  // stage 9
  iadst16_stage9_ssse3(output, x);
}